

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_initStats_ultra
               (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE **ppBVar1;
  undefined8 *puVar2;
  ulong uVar3;
  seqDef *psVar4;
  ulong uVar5;
  uint uVar6;
  bool bVar7;
  undefined8 uVar8;
  ZSTD_optimal_t *pZVar9;
  ZSTD_match_t *pZVar10;
  optState_t *optPtr;
  U32 UVar11;
  U32 UVar12;
  U32 UVar13;
  U32 UVar14;
  int iVar15;
  ulong *puVar16;
  int iVar17;
  ulong *iend;
  uint *puVar18;
  ulong *puVar19;
  long lVar20;
  uint uVar21;
  ZSTD_optimal_t *pZVar22;
  uint uVar23;
  ZSTD_optimal_t *pZVar24;
  BYTE *pBVar25;
  BYTE *pBVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  BYTE *base_1;
  BYTE *pBVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  ulong uVar34;
  seqStore_t *psVar35;
  ulong uVar36;
  ulong *puVar37;
  ulong *puVar38;
  ulong uVar39;
  BYTE *pBVar40;
  BYTE *pBVar41;
  uint uVar42;
  BYTE *pStart;
  ulong *puVar43;
  BYTE *base;
  ulong uVar44;
  uint uVar45;
  ulong *puVar46;
  ulong *puVar47;
  ulong uVar48;
  ulong *puVar49;
  bool bVar50;
  bool bVar51;
  repcodes_t rVar52;
  BYTE *pInLoopLimit;
  U32 dummy32;
  U32 tmpRep [3];
  U32 nextToUpdate3;
  ulong *local_1e8;
  BYTE *local_1e0;
  ulong *local_1b8;
  uint *local_1a8;
  BYTE *local_1a0;
  undefined1 local_194 [12];
  ZSTD_optimal_t *local_188;
  BYTE *local_180;
  ulong *local_178;
  uint *local_170;
  ulong *local_168;
  BYTE *local_160;
  ZSTD_match_t *local_158;
  seqStore_t *local_150;
  ulong *local_148;
  BYTE *local_140;
  ulong local_138;
  ulong *local_130;
  ulong *local_128;
  BYTE *local_120;
  ulong *local_118;
  ulong *local_110;
  uint local_104;
  ZSTD_optimal_t *local_100;
  ZSTD_optimal_t *local_f8;
  U32 local_f0 [3];
  U32 *local_e0;
  U32 local_d4;
  BYTE *local_d0;
  U32 *local_c8;
  ulong local_c0;
  ulong *local_b8;
  optState_t *local_b0;
  uint local_a4;
  ulong *local_a0;
  ZSTD_optimal_t *local_98;
  U32 local_8c;
  ZSTD_optimal_t *local_88;
  int local_7c;
  size_t local_78;
  ulong *local_70;
  ZSTD_optimal_t *local_68;
  undefined8 local_60;
  U32 local_58;
  ulong local_50;
  U32 *local_48;
  ulong *local_40;
  ulong local_38;
  
  local_f0 = *(U32 (*) [3])rep;
  local_a0 = (ulong *)src;
  if ((ms->opt).litLengthSum != 0) {
    __assert_fail("ms->opt.litLengthSum == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a07,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  if (seqStore->sequences != seqStore->sequencesStart) {
    __assert_fail("seqStore->sequences == seqStore->sequencesStart",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a08,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  uVar21 = (ms->window).dictLimit;
  if (uVar21 != (ms->window).lowLimit) {
    __assert_fail("ms->window.dictLimit == ms->window.lowLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a09,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  local_8c = ms->nextToUpdate;
  local_150 = seqStore;
  if (1 < uVar21 - local_8c) {
    __assert_fail("ms->window.dictLimit - ms->nextToUpdate <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4a0a,
                  "void ZSTD_initStats_ultra(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t)"
                 );
  }
  local_b0 = &ms->opt;
  pBVar26 = (ms->window).base;
  local_a4 = (ms->cParams).targetLength;
  if (0xffe < local_a4) {
    local_a4 = 0xfff;
  }
  puVar49 = (ulong *)((long)src + (srcSize - 8));
  uVar45 = (ms->cParams).minMatch;
  local_158 = (ms->opt).matchTable;
  local_f8 = (ms->opt).priceTable;
  local_78 = srcSize;
  ZSTD_rescaleFreqs(local_b0,(BYTE *)src,srcSize,2);
  puVar38 = (ulong *)((ulong)(pBVar26 + uVar21 == (BYTE *)src) + (long)src);
  local_70 = puVar49;
  psVar35 = local_150;
  if (puVar38 < puVar49) {
    iend = (ulong *)((long)local_a0 + local_78);
    uVar21 = (uint)(uVar45 != 3);
    local_38 = (ulong)(uVar21 + 3);
    local_d0 = (BYTE *)(ulong)(uVar21 + 2);
    puVar49 = (ulong *)((long)iend + -7);
    local_128 = (ulong *)((long)iend + -3);
    local_130 = (ulong *)((long)iend + -1);
    local_48 = local_f8->rep;
    local_40 = iend + -4;
    local_50 = local_38;
    local_100 = local_f8 + 1;
    local_68 = local_100;
    local_98 = local_100;
    local_88 = local_100;
    do {
      iVar17 = (int)puVar38;
      uVar45 = iVar17 - (int)local_a0;
      pBVar26 = (ms->window).base;
      uVar44 = (ulong)ms->nextToUpdate;
      uVar23 = 0;
      uVar21 = 0;
      if (pBVar26 + uVar44 <= puVar38) {
        UVar12 = (ms->cParams).minMatch;
        while( true ) {
          pZVar10 = local_158;
          uVar21 = (uint)uVar44;
          uVar27 = (uint)((long)puVar38 - (long)pBVar26);
          if (uVar27 <= uVar21) break;
          UVar11 = ZSTD_insertBt1(ms,pBVar26 + uVar44,(BYTE *)iend,UVar12,0);
          uVar44 = (ulong)(UVar11 + uVar21);
          if (UVar11 + uVar21 <= uVar21) {
LAB_0015913e:
            __assert_fail("idx < (U32)(idx + forward)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x4786,
                          "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                         );
          }
        }
        if ((ulong)((long)puVar38 - (long)pBVar26) >> 0x20 != 0) {
LAB_0015938b:
          __assert_fail("(size_t)(ip - base) <= (size_t)(U32)(-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4789,
                        "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                       );
        }
        if ((ulong)((long)iend - (long)pBVar26) >> 0x20 != 0) {
LAB_001593aa:
          __assert_fail("(size_t)(iend - base) <= (size_t)(U32)(-1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x478a,
                        "void ZSTD_updateTree_internal(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, const U32, const ZSTD_dictMode_e)"
                       );
        }
        ms->nextToUpdate = uVar27;
        psVar35 = local_150;
        uVar21 = uVar23;
        if (UVar12 - 6 < 2) {
          uVar44 = (ulong)(uVar45 == 0);
          uVar23 = (ms->cParams).targetLength;
          if (0xffe < uVar23) {
            uVar23 = 0xfff;
          }
          local_160 = (ms->window).base;
          uVar32 = iVar17 - (int)local_160;
          local_188 = (ZSTD_optimal_t *)(ulong)uVar32;
          local_138 = *puVar38 * -0x30e4432340650000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          uVar42 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar17 = uVar32 - uVar42;
          uVar27 = 0;
          if (uVar32 < uVar42) {
            iVar17 = 0;
          }
          local_140 = (BYTE *)CONCAT44(local_140._4_4_,iVar17);
          uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar33 = (ms->window).lowLimit;
          uVar31 = uVar32 - uVar28;
          if (uVar32 - uVar33 <= uVar28) {
            uVar31 = uVar33;
          }
          if (ms->loadedDictEnd != 0) {
            uVar31 = uVar33;
          }
          local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar31 + (uVar31 == 0));
          local_168 = (ulong *)ms->chainTable;
          local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar42);
          uVar36 = (ulong)((uVar42 & uVar32) * 2);
          local_170 = (uint *)((long)local_168 + uVar36 * 4);
          local_1a8 = (uint *)((long)local_168 + uVar36 * 4 + 4);
          iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_110 = (ulong *)CONCAT44(local_110._4_4_,iVar17);
          uVar42 = (ms->window).dictLimit;
          pZVar24 = (ZSTD_optimal_t *)(ulong)uVar42;
          bVar50 = true;
          local_e0 = ms->hashTable;
          UVar12 = local_e0[local_138];
          local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar32 + 8);
          uVar33 = uVar32 + 9;
          local_148 = (ulong *)CONCAT44(local_148._4_4_,uVar33);
          uVar36 = uVar44 + 3;
          puVar16 = (ulong *)((long)puVar38 + 4);
          local_178 = (ulong *)((long)puVar38 + 0xc);
          local_1b8 = (ulong *)local_d0;
          do {
            uVar28 = local_f0[0] - 1;
            if (uVar44 != 3) {
              uVar28 = local_f0[uVar44];
            }
            local_194._4_8_ = pZVar24;
            if (uVar32 < uVar42) goto LAB_0015915d;
            if (uVar28 - 1 < uVar32 - uVar42) {
              if ((uint)*puVar38 != *(uint *)((long)puVar38 - (ulong)uVar28)) goto LAB_001556b3;
              puVar37 = (ulong *)((long)puVar16 - (ulong)uVar28);
              puVar19 = puVar16;
              if (puVar16 < puVar49) {
                uVar34 = *puVar16 ^ *puVar37;
                uVar39 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
                iVar15 = (int)uVar39;
                puVar19 = local_178;
                if (*puVar37 == *puVar16) {
                  do {
                    puVar37 = puVar37 + 1;
                    if (puVar49 <= puVar19) goto LAB_001556ba;
                    uVar34 = *puVar37;
                    uVar48 = *puVar19;
                    uVar3 = 0;
                    if ((uVar48 ^ uVar34) != 0) {
                      for (; ((uVar48 ^ uVar34) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                      }
                    }
                    puVar43 = (ulong *)((uVar3 >> 3 & 0x1fffffff) + (long)puVar19);
                    puVar19 = puVar19 + 1;
                    if (uVar34 != uVar48) {
                      uVar39 = (long)puVar43 - (long)puVar16;
                      puVar19 = puVar43;
                    }
                    iVar15 = (int)uVar39;
                  } while (uVar34 == uVar48);
                }
              }
              else {
LAB_001556ba:
                if ((puVar19 < local_128) && ((uint)*puVar37 == (uint)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar19 < local_130) && ((short)*puVar37 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar19 < iend) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar19));
                }
                iVar15 = (int)puVar19 - (int)puVar16;
              }
              uVar28 = iVar15 + 4;
            }
            else {
              if (uVar32 < uVar31) goto LAB_0015917c;
LAB_001556b3:
              uVar28 = 0;
            }
            pBVar26 = (BYTE *)(ulong)uVar28;
            bVar7 = true;
            if (local_1b8 < pBVar26) {
              local_158[uVar27].off = (int)uVar44 - (uint)(uVar45 == 0);
              uVar29 = uVar27 + 1;
              local_158[uVar27].len = uVar28;
              bVar51 = (ulong *)((long)puVar38 + (long)pBVar26) != iend;
              bVar7 = bVar51 && uVar28 <= uVar23;
              local_1b8 = (ulong *)pBVar26;
              uVar27 = uVar29;
              if (!bVar51 || uVar28 > uVar23) {
                uVar21 = uVar29;
              }
            }
            if (!bVar7) break;
            uVar44 = uVar44 + 1;
            bVar50 = uVar44 < uVar36;
          } while (bVar50);
          if (!bVar50) {
            local_e0[local_138] = uVar32;
            local_1e8 = (ulong *)0x0;
            pBVar26 = (BYTE *)0x0;
            do {
              bVar50 = iVar17 == 0;
              iVar17 = iVar17 + -1;
              uVar21 = uVar27;
              if ((bVar50) || (UVar12 < (uint)local_180)) break;
              puVar16 = local_1e8;
              if (pBVar26 < local_1e8) {
                puVar16 = (ulong *)pBVar26;
              }
              if ((uint)local_188 <= UVar12) goto LAB_0015919b;
              if ((ZSTD_optimal_t *)((long)puVar16 + (ulong)UVar12) < pZVar24) goto LAB_001591ba;
              pBVar25 = local_160 + UVar12;
              if (((uint)pZVar24 <= UVar12) &&
                 (iVar15 = bcmp(pBVar25,puVar38,(size_t)puVar16),
                 pZVar24 = (ZSTD_optimal_t *)local_194._4_8_, iVar15 != 0)) goto LAB_00159274;
              puVar19 = (ulong *)((long)puVar38 + (long)puVar16);
              puVar37 = (ulong *)(pBVar25 + (long)puVar16);
              puVar43 = puVar19;
              if (puVar19 < puVar49) {
                uVar36 = *puVar19 ^ *puVar37;
                uVar44 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                pBVar30 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
                if (*puVar37 == *puVar19) {
                  do {
                    puVar43 = puVar43 + 1;
                    puVar37 = puVar37 + 1;
                    if (puVar49 <= puVar43) goto LAB_001558c5;
                    uVar36 = *puVar43 ^ *puVar37;
                    uVar44 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    pBVar30 = (BYTE *)((long)puVar43 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                  } while (*puVar37 == *puVar43);
                }
              }
              else {
LAB_001558c5:
                if ((puVar43 < local_128) && ((uint)*puVar37 == (uint)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar43 < local_130) && ((short)*puVar37 == (short)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar43 < iend) {
                  puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar43));
                }
                pBVar30 = (BYTE *)((long)puVar43 - (long)puVar19);
              }
              pBVar30 = pBVar30 + (long)puVar16;
              if (local_1b8 < pBVar30) {
                if (uVar33 < UVar12 || uVar33 - UVar12 == 0) goto LAB_00159293;
                if ((BYTE *)(ulong)(uVar33 - UVar12) < pBVar30) {
                  uVar33 = UVar12 + (U32)pBVar30;
                }
                local_158[uVar27].off = (uVar32 + 2) - UVar12;
                local_158[uVar27].len = (U32)pBVar30;
                uVar27 = uVar27 + 1;
                local_1b8 = (ulong *)pBVar30;
                if ((pBVar30 < (BYTE *)0x1001) && ((ulong *)(pBVar30 + (long)puVar38) != iend))
                goto LAB_00155999;
LAB_00155a26:
                bVar50 = false;
                pBVar30 = pBVar26;
              }
              else {
LAB_00155999:
                puVar18 = (uint *)((long)local_168 + (ulong)((UVar12 & (uint)local_120) * 2) * 4);
                if (*(byte *)((long)puVar38 + (long)pBVar30) <= pBVar25[(long)pBVar30]) {
                  *local_1a8 = UVar12;
                  local_1e8 = (ulong *)pBVar30;
                  local_1a8 = puVar18;
                  if ((uint)local_140 < UVar12) goto LAB_001559fd;
                  local_1a8 = (uint *)local_194;
                  goto LAB_00155a26;
                }
                *local_170 = UVar12;
                if ((uint)local_140 < UVar12) {
                  puVar18 = puVar18 + 1;
                  pBVar26 = pBVar30;
                  local_170 = puVar18;
LAB_001559fd:
                  UVar12 = *puVar18;
                  bVar50 = true;
                  pBVar30 = pBVar26;
                }
                else {
                  bVar50 = false;
                  local_170 = (uint *)local_194;
                }
              }
              pBVar26 = pBVar30;
              uVar21 = uVar27;
            } while (bVar50);
LAB_001565a2:
            *local_1a8 = 0;
            *local_170 = 0;
            if (uVar33 <= (uint)local_118) goto LAB_00159407;
            ms->nextToUpdate = uVar33 - 8;
            psVar35 = local_150;
          }
        }
        else if (UVar12 == 5) {
          uVar44 = (ulong)(uVar45 == 0);
          uVar23 = (ms->cParams).targetLength;
          if (0xffe < uVar23) {
            uVar23 = 0xfff;
          }
          local_160 = (ms->window).base;
          uVar42 = iVar17 - (int)local_160;
          local_188 = (ZSTD_optimal_t *)(ulong)uVar42;
          local_138 = *puVar38 * -0x30e4432345000000 >> (-(char)(ms->cParams).hashLog & 0x3fU);
          uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar17 = uVar42 - uVar27;
          if (uVar42 < uVar27) {
            iVar17 = 0;
          }
          local_140 = (BYTE *)CONCAT44(local_140._4_4_,iVar17);
          uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar32 = (ms->window).lowLimit;
          uVar31 = uVar42 - uVar33;
          if (uVar42 - uVar32 <= uVar33) {
            uVar31 = uVar32;
          }
          if (ms->loadedDictEnd != 0) {
            uVar31 = uVar32;
          }
          local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar31 + (uVar31 == 0));
          local_168 = (ulong *)ms->chainTable;
          local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar27);
          uVar36 = (ulong)((uVar27 & uVar42) * 2);
          local_170 = (uint *)((long)local_168 + uVar36 * 4);
          local_1a8 = (uint *)((long)local_168 + uVar36 * 4 + 4);
          iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_110 = (ulong *)CONCAT44(local_110._4_4_,iVar17);
          uVar27 = (ms->window).dictLimit;
          pZVar24 = (ZSTD_optimal_t *)(ulong)uVar27;
          bVar50 = true;
          local_e0 = ms->hashTable;
          UVar12 = local_e0[local_138];
          local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar42 + 8);
          uVar33 = uVar42 + 9;
          local_148 = (ulong *)CONCAT44(local_148._4_4_,uVar33);
          uVar36 = uVar44 + 3;
          puVar16 = (ulong *)((long)puVar38 + 4);
          local_178 = (ulong *)((long)puVar38 + 0xc);
          local_1b8 = (ulong *)local_d0;
          uVar32 = 0;
          do {
            uVar28 = local_f0[0] - 1;
            if (uVar44 != 3) {
              uVar28 = local_f0[uVar44];
            }
            local_194._4_8_ = pZVar24;
            if (uVar42 < uVar27) goto LAB_0015915d;
            if (uVar28 - 1 < uVar42 - uVar27) {
              if ((uint)*puVar38 != *(uint *)((long)puVar38 - (ulong)uVar28)) goto LAB_00155c70;
              puVar37 = (ulong *)((long)puVar16 - (ulong)uVar28);
              puVar19 = puVar16;
              if (puVar16 < puVar49) {
                uVar34 = *puVar16 ^ *puVar37;
                uVar39 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
                iVar15 = (int)uVar39;
                puVar19 = local_178;
                if (*puVar37 == *puVar16) {
                  do {
                    puVar37 = puVar37 + 1;
                    if (puVar49 <= puVar19) goto LAB_00155c77;
                    uVar34 = *puVar37;
                    uVar48 = *puVar19;
                    uVar3 = 0;
                    if ((uVar48 ^ uVar34) != 0) {
                      for (; ((uVar48 ^ uVar34) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                      }
                    }
                    puVar43 = (ulong *)((uVar3 >> 3 & 0x1fffffff) + (long)puVar19);
                    puVar19 = puVar19 + 1;
                    if (uVar34 != uVar48) {
                      uVar39 = (long)puVar43 - (long)puVar16;
                      puVar19 = puVar43;
                    }
                    iVar15 = (int)uVar39;
                  } while (uVar34 == uVar48);
                }
              }
              else {
LAB_00155c77:
                if ((puVar19 < local_128) && ((uint)*puVar37 == (uint)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar19 < local_130) && ((short)*puVar37 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar19 < iend) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar19));
                }
                iVar15 = (int)puVar19 - (int)puVar16;
              }
              uVar28 = iVar15 + 4;
            }
            else {
              if (uVar42 < uVar31) goto LAB_0015917c;
LAB_00155c70:
              uVar28 = 0;
            }
            pBVar26 = (BYTE *)(ulong)uVar28;
            bVar7 = true;
            uVar29 = uVar32;
            if (local_1b8 < pBVar26) {
              local_158[uVar32].off = (int)uVar44 - (uint)(uVar45 == 0);
              uVar29 = uVar32 + 1;
              local_158[uVar32].len = uVar28;
              bVar51 = (ulong *)((long)puVar38 + (long)pBVar26) != iend;
              bVar7 = bVar51 && uVar28 <= uVar23;
              local_1b8 = (ulong *)pBVar26;
              if (!bVar51 || uVar28 > uVar23) {
                uVar21 = uVar29;
              }
            }
            if (!bVar7) break;
            uVar44 = uVar44 + 1;
            bVar50 = uVar44 < uVar36;
            uVar32 = uVar29;
          } while (bVar50);
          if (!bVar50) {
            local_e0[local_138] = uVar42;
            local_1e8 = (ulong *)0x0;
            pBVar26 = (BYTE *)0x0;
            uVar21 = uVar29;
            do {
              bVar50 = iVar17 == 0;
              iVar17 = iVar17 + -1;
              if ((bVar50) || (UVar12 < (uint)local_180)) break;
              puVar16 = local_1e8;
              if (pBVar26 < local_1e8) {
                puVar16 = (ulong *)pBVar26;
              }
              if ((uint)local_188 <= UVar12) goto LAB_0015919b;
              if ((ZSTD_optimal_t *)((long)puVar16 + (ulong)UVar12) < pZVar24) goto LAB_001591ba;
              pBVar25 = local_160 + UVar12;
              if (((uint)pZVar24 <= UVar12) &&
                 (iVar15 = bcmp(pBVar25,puVar38,(size_t)puVar16),
                 pZVar24 = (ZSTD_optimal_t *)local_194._4_8_, iVar15 != 0)) goto LAB_00159274;
              puVar19 = (ulong *)((long)puVar38 + (long)puVar16);
              puVar37 = (ulong *)(pBVar25 + (long)puVar16);
              puVar43 = puVar19;
              if (puVar19 < puVar49) {
                uVar36 = *puVar19 ^ *puVar37;
                uVar44 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                pBVar30 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
                if (*puVar37 == *puVar19) {
                  do {
                    puVar43 = puVar43 + 1;
                    puVar37 = puVar37 + 1;
                    if (puVar49 <= puVar43) goto LAB_00155e82;
                    uVar36 = *puVar43 ^ *puVar37;
                    uVar44 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    pBVar30 = (BYTE *)((long)puVar43 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                  } while (*puVar37 == *puVar43);
                }
              }
              else {
LAB_00155e82:
                if ((puVar43 < local_128) && ((uint)*puVar37 == (uint)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar43 < local_130) && ((short)*puVar37 == (short)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar43 < iend) {
                  puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar43));
                }
                pBVar30 = (BYTE *)((long)puVar43 - (long)puVar19);
              }
              pBVar30 = pBVar30 + (long)puVar16;
              if (local_1b8 < pBVar30) {
                if (uVar33 < UVar12 || uVar33 - UVar12 == 0) goto LAB_00159293;
                if ((BYTE *)(ulong)(uVar33 - UVar12) < pBVar30) {
                  uVar33 = UVar12 + (U32)pBVar30;
                }
                local_158[uVar21].off = (uVar42 + 2) - UVar12;
                local_158[uVar21].len = (U32)pBVar30;
                uVar21 = uVar21 + 1;
                local_1b8 = (ulong *)pBVar30;
                if ((pBVar30 < (BYTE *)0x1001) && ((ulong *)(pBVar30 + (long)puVar38) != iend))
                goto LAB_00155f56;
LAB_00155fe3:
                bVar50 = false;
                pBVar30 = pBVar26;
              }
              else {
LAB_00155f56:
                puVar18 = (uint *)((long)local_168 + (ulong)((UVar12 & (uint)local_120) * 2) * 4);
                if (*(byte *)((long)puVar38 + (long)pBVar30) <= pBVar25[(long)pBVar30]) {
                  *local_1a8 = UVar12;
                  local_1e8 = (ulong *)pBVar30;
                  local_1a8 = puVar18;
                  if ((uint)local_140 < UVar12) goto LAB_00155fba;
                  local_1a8 = (uint *)local_194;
                  goto LAB_00155fe3;
                }
                *local_170 = UVar12;
                if ((uint)local_140 < UVar12) {
                  puVar18 = puVar18 + 1;
                  pBVar26 = pBVar30;
                  local_170 = puVar18;
LAB_00155fba:
                  UVar12 = *puVar18;
                  bVar50 = true;
                  pBVar30 = pBVar26;
                }
                else {
                  bVar50 = false;
                  local_170 = (uint *)local_194;
                }
              }
              pBVar26 = pBVar30;
            } while (bVar50);
            goto LAB_001565a2;
          }
        }
        else if (UVar12 == 3) {
          puVar16 = (ulong *)(ulong)(uVar45 == 0);
          uVar23 = (ms->cParams).targetLength;
          if (0xffe < uVar23) {
            uVar23 = 0xfff;
          }
          local_160 = (ms->window).base;
          uVar42 = iVar17 - (int)local_160;
          local_188 = (ZSTD_optimal_t *)(ulong)uVar42;
          uVar27 = 0;
          local_138 = (ulong)((uint)*puVar38 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU)
                             );
          uVar21 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar17 = uVar42 - uVar21;
          if (uVar42 < uVar21) {
            iVar17 = 0;
          }
          local_140 = (BYTE *)CONCAT44(local_140._4_4_,iVar17);
          uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar32 = (ms->window).lowLimit;
          uVar33 = uVar42 - uVar31;
          if (uVar42 - uVar32 <= uVar31) {
            uVar33 = uVar32;
          }
          if (ms->loadedDictEnd != 0) {
            uVar33 = uVar32;
          }
          local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar33 + (uVar33 == 0));
          local_168 = (ulong *)ms->chainTable;
          local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar21);
          uVar44 = (ulong)((uVar21 & uVar42) * 2);
          local_170 = (uint *)((long)local_168 + uVar44 * 4);
          local_1a8 = (uint *)((long)local_168 + uVar44 * 4 + 4);
          iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          uVar32 = (ms->window).dictLimit;
          bVar50 = true;
          local_e0 = ms->hashTable;
          local_194._4_8_ = ZEXT48(ms->hashTable[local_138]);
          local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar42 + 8);
          uVar31 = uVar42 + 9;
          local_148 = (ulong *)CONCAT44(local_148._4_4_,uVar31);
          local_178 = (ulong *)((long)puVar16 + 3);
          puVar19 = (ulong *)((long)puVar38 + 3);
          local_110 = (ulong *)((long)puVar38 + 0xb);
          pBVar26 = local_d0;
          local_1b8 = local_110;
          do {
            UVar12 = local_f0[0] - 1;
            if (puVar16 != (ulong *)0x3) {
              UVar12 = local_f0[(long)puVar16];
            }
            if (uVar42 < uVar32) goto LAB_0015915d;
            if (UVar12 - 1 < uVar42 - uVar32) {
              if (((*(uint *)((long)puVar38 - (ulong)UVar12) ^ (uint)*puVar38) & 0xffffff) == 0) {
                puVar43 = (ulong *)((long)puVar19 - (ulong)UVar12);
                puVar37 = puVar19;
                if (puVar19 < puVar49) {
                  uVar36 = *puVar19 ^ *puVar43;
                  uVar44 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = uVar44 >> 3 & 0x1fffffff;
                  iVar15 = (int)uVar44;
                  puVar37 = local_110;
                  if (*puVar43 == *puVar19) {
                    do {
                      puVar43 = puVar43 + 1;
                      if (puVar49 <= puVar37) goto LAB_00155392;
                      uVar36 = *puVar43;
                      uVar39 = *puVar37;
                      uVar34 = 0;
                      if ((uVar39 ^ uVar36) != 0) {
                        for (; ((uVar39 ^ uVar36) >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                        }
                      }
                      puVar46 = (ulong *)((uVar34 >> 3 & 0x1fffffff) + (long)puVar37);
                      puVar37 = puVar37 + 1;
                      if (uVar36 != uVar39) {
                        uVar44 = (long)puVar46 - (long)puVar19;
                        puVar37 = puVar46;
                      }
                      iVar15 = (int)uVar44;
                    } while (uVar36 == uVar39);
                  }
                }
                else {
LAB_00155392:
                  if ((puVar37 < local_128) && ((uint)*puVar43 == (uint)*puVar37)) {
                    puVar37 = (ulong *)((long)puVar37 + 4);
                    puVar43 = (ulong *)((long)puVar43 + 4);
                  }
                  if ((puVar37 < local_130) && ((short)*puVar43 == (short)*puVar37)) {
                    puVar37 = (ulong *)((long)puVar37 + 2);
                    puVar43 = (ulong *)((long)puVar43 + 2);
                  }
                  if (puVar37 < iend) {
                    puVar37 = (ulong *)((long)puVar37 + (ulong)((BYTE)*puVar43 == (BYTE)*puVar37));
                  }
                  iVar15 = (int)puVar37 - (int)puVar19;
                }
                pBVar25 = (BYTE *)(ulong)(iVar15 + 3);
              }
              else {
                pBVar25 = (BYTE *)0x0;
              }
            }
            else {
              if (uVar42 < uVar33) goto LAB_0015917c;
              pBVar25 = (BYTE *)0x0;
            }
            uVar21 = (uint)pBVar25;
            bVar7 = true;
            if (pBVar26 < pBVar25) {
              local_158[uVar27].off = (int)puVar16 - (uint)(uVar45 == 0);
              uVar28 = uVar27 + 1;
              local_158[uVar27].len = uVar21;
              bVar51 = (ulong *)((long)puVar38 + (long)pBVar25) != iend;
              bVar7 = bVar51 && uVar21 <= uVar23;
              local_1b8 = (ulong *)((ulong)local_1b8 & 0xffffffff);
              pBVar26 = pBVar25;
              uVar27 = uVar28;
              if (!bVar51 || uVar21 > uVar23) {
                local_1b8 = (ulong *)(ulong)uVar28;
              }
            }
            if (!bVar7) break;
            puVar16 = (ulong *)((long)puVar16 + 1);
            bVar50 = puVar16 < local_178;
          } while (bVar50);
          uVar21 = (uint)local_1b8;
          if (!bVar50) {
            if (pBVar26 < (BYTE *)0x3) {
              UVar12 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_8c,(BYTE *)puVar38);
              bVar50 = true;
              if ((uint)local_180 <= UVar12) {
                uVar21 = (uint)local_188;
                if (uVar21 - UVar12 < 0x40000) {
                  puVar19 = (ulong *)(local_160 + UVar12);
                  puVar16 = puVar38;
                  if (puVar38 < puVar49) {
                    uVar36 = *puVar38 ^ *puVar19;
                    uVar44 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    pBVar25 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
                    if (*puVar19 == *puVar38) {
                      do {
                        puVar16 = puVar16 + 1;
                        puVar19 = puVar19 + 1;
                        if (puVar49 <= puVar16) goto LAB_001566fa;
                        uVar36 = *puVar16 ^ *puVar19;
                        uVar44 = 0;
                        if (uVar36 != 0) {
                          for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        pBVar25 = (BYTE *)((long)puVar16 +
                                          ((uVar44 >> 3 & 0x1fffffff) - (long)puVar38));
                      } while (*puVar19 == *puVar16);
                    }
                  }
                  else {
LAB_001566fa:
                    if ((puVar16 < local_128) && ((uint)*puVar19 == (uint)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 4);
                      puVar19 = (ulong *)((long)puVar19 + 4);
                    }
                    if ((puVar16 < local_130) && ((short)*puVar19 == (short)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 2);
                      puVar19 = (ulong *)((long)puVar19 + 2);
                    }
                    if (puVar16 < iend) {
                      puVar16 = (ulong *)((long)puVar16 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar16))
                      ;
                    }
                    pBVar25 = (BYTE *)((long)puVar16 - (long)puVar38);
                  }
                  if ((BYTE *)0x2 < pBVar25) {
                    if (uVar21 <= UVar12) {
LAB_001594c1:
                      __assert_fail("current > matchIndex3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4806,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    if (uVar27 != 0) {
LAB_001594e0:
                      __assert_fail("mnum==0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                    ,0x4807,
                                    "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                                   );
                    }
                    pZVar10->off = (uVar21 - UVar12) + 2;
                    pZVar10->len = (U32)pBVar25;
                    pBVar26 = pBVar25;
                    if (((BYTE *)(ulong)uVar23 < pBVar25) ||
                       (uVar27 = 1, (ulong *)((long)puVar38 + (long)pBVar25) == iend)) {
                      ms->nextToUpdate = uVar21 + 1;
                      uVar27 = 1;
                      bVar50 = false;
                      local_1b8._0_4_ = 1;
                    }
                  }
                }
              }
              psVar35 = local_150;
              uVar31 = (uint)local_148;
              uVar21 = (uint)local_1b8;
              if (!bVar50) goto LAB_00156aa5;
            }
            UVar12 = (U32)local_188;
            local_e0[local_138] = UVar12;
            local_1b8 = (ulong *)(ulong)uVar27;
            local_1e8 = (ulong *)0x0;
            psVar35 = local_150;
            pZVar24 = (ZSTD_optimal_t *)local_194._4_8_;
            pBVar25 = (BYTE *)0x0;
            do {
              bVar50 = iVar17 == 0;
              iVar17 = iVar17 + -1;
              if (bVar50) break;
              uVar21 = (uint)pZVar24;
              if (uVar21 < (uint)local_180) break;
              puVar16 = local_1e8;
              if (pBVar25 < local_1e8) {
                puVar16 = (ulong *)pBVar25;
              }
              if ((uint)local_188 <= uVar21) goto LAB_0015919b;
              if ((BYTE *)((long)puVar16 + ((ulong)pZVar24 & 0xffffffff)) < (BYTE *)(ulong)uVar32)
              goto LAB_001591ba;
              pBVar30 = local_160 + ((ulong)pZVar24 & 0xffffffff);
              local_194._4_8_ = pZVar24;
              if ((uVar32 <= uVar21) &&
                 (iVar15 = bcmp(pBVar30,puVar38,(size_t)puVar16), iVar15 != 0)) goto LAB_00159274;
              psVar35 = local_150;
              pZVar24 = (ZSTD_optimal_t *)local_194._4_8_;
              puVar19 = (ulong *)((long)puVar38 + (long)puVar16);
              puVar37 = (ulong *)(pBVar30 + (long)puVar16);
              puVar43 = puVar19;
              if (puVar19 < puVar49) {
                uVar36 = *puVar19 ^ *puVar37;
                uVar44 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                pBVar41 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
                if (*puVar37 == *puVar19) {
                  do {
                    puVar43 = puVar43 + 1;
                    puVar37 = puVar37 + 1;
                    if (puVar49 <= puVar43) goto LAB_001568fe;
                    uVar36 = *puVar43 ^ *puVar37;
                    uVar44 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    pBVar41 = (BYTE *)((long)puVar43 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                  } while (*puVar37 == *puVar43);
                }
              }
              else {
LAB_001568fe:
                if ((puVar43 < local_128) && ((uint)*puVar37 == (uint)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar43 < local_130) && ((short)*puVar37 == (short)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar43 < iend) {
                  puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar43));
                }
                pBVar41 = (BYTE *)((long)puVar43 - (long)puVar19);
              }
              pBVar41 = pBVar41 + (long)puVar16;
              uVar21 = (uint)local_194._4_8_;
              if (pBVar26 < pBVar41) {
                if (uVar31 < uVar21 || uVar31 - uVar21 == 0) goto LAB_00159293;
                if ((BYTE *)(ulong)(uVar31 - uVar21) < pBVar41) {
                  uVar31 = uVar21 + (U32)pBVar41;
                }
                local_158[(long)local_1b8].off = (UVar12 + 2) - uVar21;
                local_158[(long)local_1b8].len = (U32)pBVar41;
                local_1b8 = (ulong *)(ulong)((uint)local_1b8 + 1);
                pBVar26 = pBVar41;
                if ((pBVar41 < (BYTE *)0x1001) && ((ulong *)((long)puVar38 + (long)pBVar41) != iend)
                   ) goto LAB_001569d2;
LAB_00156a5f:
                bVar50 = false;
                pBVar41 = pBVar25;
              }
              else {
LAB_001569d2:
                puVar18 = (uint *)((long)local_168 + (ulong)((uVar21 & (uint)local_120) * 2) * 4);
                if (*(byte *)((long)puVar38 + (long)pBVar41) <= pBVar30[(long)pBVar41]) {
                  *local_1a8 = uVar21;
                  local_1e8 = (ulong *)pBVar41;
                  local_1a8 = puVar18;
                  if ((uint)local_140 < uVar21) goto LAB_00156a36;
                  local_1a8 = (uint *)local_194;
                  goto LAB_00156a5f;
                }
                *local_170 = uVar21;
                if ((uint)local_140 < uVar21) {
                  puVar18 = puVar18 + 1;
                  pBVar25 = pBVar41;
                  local_170 = puVar18;
LAB_00156a36:
                  pZVar24 = (ZSTD_optimal_t *)(ulong)*puVar18;
                  bVar50 = true;
                  pBVar41 = pBVar25;
                }
                else {
                  bVar50 = false;
                  local_170 = (uint *)local_194;
                }
              }
              pBVar25 = pBVar41;
            } while (bVar50);
            *local_1a8 = 0;
            *local_170 = 0;
            if (uVar31 <= (uint)local_118) {
LAB_00159407:
              __assert_fail("matchEndIdx > current+8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4873,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            ms->nextToUpdate = uVar31 - 8;
            uVar21 = (uint)local_1b8;
          }
        }
        else {
          uVar44 = (ulong)(uVar45 == 0);
          uVar23 = (ms->cParams).targetLength;
          if (0xffe < uVar23) {
            uVar23 = 0xfff;
          }
          local_160 = (ms->window).base;
          uVar42 = iVar17 - (int)local_160;
          local_188 = (ZSTD_optimal_t *)(ulong)uVar42;
          local_138 = (ulong)((uint)*puVar38 * -0x61c8864f >> (-(char)(ms->cParams).hashLog & 0x1fU)
                             );
          uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
          iVar17 = uVar42 - uVar27;
          if (uVar42 < uVar27) {
            iVar17 = 0;
          }
          local_140 = (BYTE *)CONCAT44(local_140._4_4_,iVar17);
          uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
          uVar32 = (ms->window).lowLimit;
          uVar31 = uVar42 - uVar33;
          if (uVar42 - uVar32 <= uVar33) {
            uVar31 = uVar32;
          }
          if (ms->loadedDictEnd != 0) {
            uVar31 = uVar32;
          }
          local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar31 + (uVar31 == 0));
          local_168 = (ulong *)ms->chainTable;
          local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar27);
          uVar36 = (ulong)((uVar27 & uVar42) * 2);
          local_170 = (uint *)((long)local_168 + uVar36 * 4);
          local_1a8 = (uint *)((long)local_168 + uVar36 * 4 + 4);
          iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
          local_110 = (ulong *)CONCAT44(local_110._4_4_,iVar17);
          uVar27 = (ms->window).dictLimit;
          pZVar24 = (ZSTD_optimal_t *)(ulong)uVar27;
          bVar50 = true;
          local_e0 = ms->hashTable;
          UVar12 = local_e0[local_138];
          local_118 = (ulong *)CONCAT44(local_118._4_4_,uVar42 + 8);
          uVar33 = uVar42 + 9;
          local_148 = (ulong *)CONCAT44(local_148._4_4_,uVar33);
          uVar36 = uVar44 + 3;
          puVar16 = (ulong *)((long)puVar38 + 4);
          local_178 = (ulong *)((long)puVar38 + 0xc);
          local_1b8 = (ulong *)local_d0;
          uVar32 = 0;
          do {
            uVar28 = local_f0[0] - 1;
            if (uVar44 != 3) {
              uVar28 = local_f0[uVar44];
            }
            local_194._4_8_ = pZVar24;
            if (uVar42 < uVar27) {
LAB_0015915d:
              __assert_fail("current >= dictLimit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x47d0,
                            "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                           );
            }
            if (uVar28 - 1 < uVar42 - uVar27) {
              if ((uint)*puVar38 != *(uint *)((long)puVar38 - (ulong)uVar28)) goto LAB_00156221;
              puVar37 = (ulong *)((long)puVar16 - (ulong)uVar28);
              puVar19 = puVar16;
              if (puVar16 < puVar49) {
                uVar34 = *puVar16 ^ *puVar37;
                uVar39 = 0;
                if (uVar34 != 0) {
                  for (; (uVar34 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                  }
                }
                uVar39 = uVar39 >> 3 & 0x1fffffff;
                iVar15 = (int)uVar39;
                puVar19 = local_178;
                if (*puVar37 == *puVar16) {
                  do {
                    puVar37 = puVar37 + 1;
                    if (puVar49 <= puVar19) goto LAB_00156228;
                    uVar34 = *puVar37;
                    uVar48 = *puVar19;
                    uVar3 = 0;
                    if ((uVar48 ^ uVar34) != 0) {
                      for (; ((uVar48 ^ uVar34) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
                      }
                    }
                    puVar43 = (ulong *)((uVar3 >> 3 & 0x1fffffff) + (long)puVar19);
                    puVar19 = puVar19 + 1;
                    if (uVar34 != uVar48) {
                      uVar39 = (long)puVar43 - (long)puVar16;
                      puVar19 = puVar43;
                    }
                    iVar15 = (int)uVar39;
                  } while (uVar34 == uVar48);
                }
              }
              else {
LAB_00156228:
                if ((puVar19 < local_128) && ((uint)*puVar37 == (uint)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar19 < local_130) && ((short)*puVar37 == (short)*puVar19)) {
                  puVar19 = (ulong *)((long)puVar19 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar19 < iend) {
                  puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar19));
                }
                iVar15 = (int)puVar19 - (int)puVar16;
              }
              uVar28 = iVar15 + 4;
            }
            else {
              if (uVar42 < uVar31) {
LAB_0015917c:
                __assert_fail("current >= windowLow",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x47d9,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
LAB_00156221:
              uVar28 = 0;
            }
            pBVar26 = (BYTE *)(ulong)uVar28;
            bVar7 = true;
            uVar29 = uVar32;
            if (local_1b8 < pBVar26) {
              local_158[uVar32].off = (int)uVar44 - (uint)(uVar45 == 0);
              uVar29 = uVar32 + 1;
              local_158[uVar32].len = uVar28;
              bVar51 = (ulong *)((long)puVar38 + (long)pBVar26) != iend;
              bVar7 = bVar51 && uVar28 <= uVar23;
              local_1b8 = (ulong *)pBVar26;
              if (!bVar51 || uVar28 > uVar23) {
                uVar21 = uVar29;
              }
            }
            if (!bVar7) break;
            uVar44 = uVar44 + 1;
            bVar50 = uVar44 < uVar36;
            uVar32 = uVar29;
          } while (bVar50);
          if (!bVar50) {
            local_e0[local_138] = uVar42;
            local_1e8 = (ulong *)0x0;
            pBVar26 = (BYTE *)0x0;
            do {
              bVar50 = iVar17 == 0;
              iVar17 = iVar17 + -1;
              uVar21 = uVar29;
              if ((bVar50) || (UVar12 < (uint)local_180)) break;
              puVar16 = local_1e8;
              if (pBVar26 < local_1e8) {
                puVar16 = (ulong *)pBVar26;
              }
              if ((uint)local_188 <= UVar12) {
LAB_0015919b:
                __assert_fail("current > matchIndex",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x4819,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              if ((ZSTD_optimal_t *)((long)puVar16 + (ulong)UVar12) < pZVar24) {
LAB_001591ba:
                __assert_fail("matchIndex+matchLength >= dictLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481c,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              pBVar25 = local_160 + UVar12;
              if (((uint)pZVar24 <= UVar12) &&
                 (iVar15 = bcmp(pBVar25,puVar38,(size_t)puVar16),
                 pZVar24 = (ZSTD_optimal_t *)local_194._4_8_, iVar15 != 0)) {
LAB_00159274:
                __assert_fail("memcmp(match, ip, matchLength) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x481e,
                              "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                             );
              }
              puVar19 = (ulong *)((long)puVar38 + (long)puVar16);
              puVar37 = (ulong *)(pBVar25 + (long)puVar16);
              puVar43 = puVar19;
              if (puVar19 < puVar49) {
                uVar36 = *puVar19 ^ *puVar37;
                uVar44 = 0;
                if (uVar36 != 0) {
                  for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                  }
                }
                pBVar30 = (BYTE *)(uVar44 >> 3 & 0x1fffffff);
                if (*puVar37 == *puVar19) {
                  do {
                    puVar43 = puVar43 + 1;
                    puVar37 = puVar37 + 1;
                    if (puVar49 <= puVar43) goto LAB_00156433;
                    uVar36 = *puVar43 ^ *puVar37;
                    uVar44 = 0;
                    if (uVar36 != 0) {
                      for (; (uVar36 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                      }
                    }
                    pBVar30 = (BYTE *)((long)puVar43 + ((uVar44 >> 3 & 0x1fffffff) - (long)puVar19))
                    ;
                  } while (*puVar37 == *puVar43);
                }
              }
              else {
LAB_00156433:
                if ((puVar43 < local_128) && ((uint)*puVar37 == (uint)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 4);
                  puVar37 = (ulong *)((long)puVar37 + 4);
                }
                if ((puVar43 < local_130) && ((short)*puVar37 == (short)*puVar43)) {
                  puVar43 = (ulong *)((long)puVar43 + 2);
                  puVar37 = (ulong *)((long)puVar37 + 2);
                }
                if (puVar43 < iend) {
                  puVar43 = (ulong *)((long)puVar43 + (ulong)((BYTE)*puVar37 == (BYTE)*puVar43));
                }
                pBVar30 = (BYTE *)((long)puVar43 - (long)puVar19);
              }
              pBVar30 = pBVar30 + (long)puVar16;
              if (local_1b8 < pBVar30) {
                if (uVar33 < UVar12 || uVar33 - UVar12 == 0) {
LAB_00159293:
                  __assert_fail("matchEndIdx > matchIndex",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x482b,
                                "U32 ZSTD_insertBtAndGetAllMatches(ZSTD_match_t *, ZSTD_matchState_t *, U32 *, const BYTE *const, const BYTE *const, const ZSTD_dictMode_e, const U32 *, const U32, const U32, const U32)"
                               );
                }
                if ((BYTE *)(ulong)(uVar33 - UVar12) < pBVar30) {
                  uVar33 = UVar12 + (U32)pBVar30;
                }
                local_158[uVar29].off = (uVar42 + 2) - UVar12;
                local_158[uVar29].len = (U32)pBVar30;
                uVar29 = uVar29 + 1;
                local_1b8 = (ulong *)pBVar30;
                if ((pBVar30 < (BYTE *)0x1001) && ((ulong *)(pBVar30 + (long)puVar38) != iend))
                goto LAB_00156507;
LAB_00156594:
                bVar50 = false;
                pBVar30 = pBVar26;
              }
              else {
LAB_00156507:
                puVar18 = (uint *)((long)local_168 + (ulong)((UVar12 & (uint)local_120) * 2) * 4);
                if (*(byte *)((long)puVar38 + (long)pBVar30) <= pBVar25[(long)pBVar30]) {
                  *local_1a8 = UVar12;
                  local_1e8 = (ulong *)pBVar30;
                  local_1a8 = puVar18;
                  if ((uint)local_140 < UVar12) goto LAB_0015656b;
                  local_1a8 = (uint *)local_194;
                  goto LAB_00156594;
                }
                *local_170 = UVar12;
                if ((uint)local_140 < UVar12) {
                  puVar18 = puVar18 + 1;
                  pBVar26 = pBVar30;
                  local_170 = puVar18;
LAB_0015656b:
                  UVar12 = *puVar18;
                  bVar50 = true;
                  pBVar30 = pBVar26;
                }
                else {
                  bVar50 = false;
                  local_170 = (uint *)local_194;
                }
              }
              pBVar26 = pBVar30;
              uVar21 = uVar29;
            } while (bVar50);
            goto LAB_001565a2;
          }
        }
      }
LAB_00156aa5:
      pZVar24 = local_f8;
      if (uVar21 == 0) {
        puVar38 = (ulong *)((long)puVar38 + 1);
        uVar44 = 0;
        iVar17 = 2;
      }
      else {
        local_48[2] = local_f0[2];
        *(undefined8 *)local_48 = local_f0._0_8_;
        local_f8->mlen = 0;
        local_f8->litlen = uVar45;
        UVar12 = ZSTD_litLengthPrice(uVar45,local_b0,2);
        pZVar24->price = UVar12;
        uVar23 = local_158[uVar21 - 1].len;
        if (local_a4 < uVar23) {
          local_d4 = local_158[uVar21 - 1].off;
          uVar21 = uVar23 + uVar45;
          local_100 = (ZSTD_optimal_t *)0x0;
          iVar17 = 7;
          local_88 = (ZSTD_optimal_t *)(ulong)uVar23;
          local_98 = (ZSTD_optimal_t *)(ulong)uVar45;
        }
        else {
          UVar11 = ZSTD_litLengthPrice(0,local_b0,2);
          uVar44 = 1;
          pZVar22 = local_68;
          do {
            pZVar22->price = 0x40000000;
            uVar44 = uVar44 + 1;
            pZVar22 = pZVar22 + 1;
          } while (local_50 != uVar44);
          uVar36 = 0;
          do {
            uVar23 = local_158[uVar36].len;
            if ((uint)uVar44 <= uVar23) {
              UVar13 = local_158[uVar36].off;
              if (UVar13 == 0xffffffff) {
LAB_00159100:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x12c2,"U32 ZSTD_highbit32(U32)");
              }
              uVar27 = 0x1f;
              if (UVar13 + 1 != 0) {
                for (; UVar13 + 1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                }
              }
              uVar42 = (uint)uVar44 * 0x100 - 0x200;
              do {
                uVar32 = (uint)uVar44;
                if (uVar32 < 3) {
LAB_0015911f:
                  __assert_fail("matchLength >= MINMATCH",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x469f,
                                "U32 ZSTD_getMatchPrice(const U32, const U32, const optState_t *const, const int)"
                               );
                }
                if ((ms->opt).priceType == zop_predef) {
                  uVar33 = 0x1f;
                  if (uVar32 - 2 != 0) {
                    for (; uVar32 - 2 >> uVar33 == 0; uVar33 = uVar33 - 1) {
                    }
                  }
                  if (0x16 < uVar33) goto LAB_001590e1;
                  iVar17 = (uVar33 + uVar27) * 0x100 + (uVar42 >> ((byte)uVar33 & 0x1f)) + 0x1000;
                }
                else {
                  uVar33 = (ms->opt).offCodeFreq[uVar27] + 1;
                  if (uVar33 == 0) goto LAB_00159100;
                  uVar31 = 0x1f;
                  if (uVar33 != 0) {
                    for (; uVar33 >> uVar31 == 0; uVar31 = uVar31 - 1) {
                    }
                  }
                  if (0x16 < uVar31) {
LAB_001590e1:
                    __assert_fail("hb + BITCOST_ACCURACY < 31",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x45cb,"U32 ZSTD_fracWeight(U32)");
                  }
                  uVar28 = uVar32 - 3;
                  if (uVar28 < 0x80) {
                    uVar28 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar28];
                  }
                  else {
                    uVar29 = 0x1f;
                    if (uVar28 != 0) {
                      for (; uVar28 >> uVar29 == 0; uVar29 = uVar29 - 1) {
                      }
                    }
                    uVar28 = (uVar29 ^ 0xffffffe0) + 0x44;
                  }
                  uVar29 = (ms->opt).matchLengthFreq[uVar28] + 1;
                  if (uVar29 == 0) goto LAB_00159100;
                  uVar6 = 0x1f;
                  if (uVar29 != 0) {
                    for (; uVar29 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                    }
                  }
                  if (0x16 < uVar6) goto LAB_001590e1;
                  iVar17 = (((ms->opt).matchLengthSumBasePrice + (ms->opt).offCodeSumBasePrice) -
                           ((uVar33 * 0x100 >> ((byte)uVar31 & 0x1f)) +
                           (uVar29 * 0x100 >> ((byte)uVar6 & 0x1f)))) +
                           ((ML_bits[uVar28] + uVar27) - (uVar31 + uVar6)) * 0x100 + 0x33;
                  pZVar24 = local_f8;
                }
                uVar44 = uVar44 & 0xffffffff;
                pZVar24[uVar44].mlen = uVar32;
                pZVar24[uVar44].off = UVar13;
                pZVar24[uVar44].litlen = uVar45;
                pZVar24[uVar44].price = iVar17 + UVar11 + UVar12;
                uVar44 = (ulong)(uVar32 + 1);
                uVar42 = uVar42 + 0x100;
              } while (uVar32 + 1 <= uVar23);
            }
            uVar36 = uVar36 + 1;
          } while (uVar36 != uVar21 + (uVar21 == 0));
          uVar21 = (int)uVar44 - 1;
          iVar17 = 0;
        }
        uVar44 = (ulong)uVar21;
        psVar35 = local_150;
      }
      if (iVar17 == 7) {
LAB_00158c7c:
        if (pZVar24->mlen != 0) {
          __assert_fail("opt[0].mlen == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4998,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        UVar12 = (U32)local_88;
        if (UVar12 == 0) {
          local_f0 = *&pZVar24[(ulong)local_100 & 0xffffffff].rep;
        }
        else {
          local_f0 = (U32  [3])
                     ZSTD_updateRep(pZVar24[(ulong)local_100 & 0xffffffff].rep,local_d4,
                                    (uint)((int)local_98 == 0));
        }
        iVar17 = (int)local_100;
        uVar21 = iVar17 + 1;
        if (0xfff < uVar21) {
          __assert_fail("storeEnd < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x49ab,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        local_188 = (ZSTD_optimal_t *)(ulong)uVar21;
        pZVar24[(long)local_188].price = local_7c;
        pZVar24[(long)local_188].off = local_d4;
        pZVar24[(long)local_188].mlen = UVar12;
        pZVar24[(long)local_188].litlen = (U32)local_98;
        *(undefined8 *)pZVar24[(long)local_188].rep = local_60;
        pZVar24[(long)local_188].rep[2] = local_58;
        uVar44 = (ulong)local_100 & 0xffffffff;
        uVar36 = (ulong)local_100 & 0xffffffff;
        uVar45 = uVar21;
        if (iVar17 != 0) {
          do {
            uVar23 = (uint)uVar36;
            uVar27 = pZVar24[uVar36].litlen + pZVar24[uVar36].mlen;
            uVar45 = (uint)uVar44;
            pZVar22 = pZVar24 + uVar36;
            iVar15 = pZVar22->price;
            UVar11 = pZVar22->off;
            UVar13 = pZVar22->mlen;
            UVar14 = pZVar22->litlen;
            pZVar22 = pZVar24 + uVar36;
            UVar12 = pZVar22->rep[0];
            uVar8 = *(undefined8 *)(&pZVar22->litlen + 2);
            pZVar9 = pZVar24 + uVar44;
            pZVar9->litlen = pZVar22->litlen;
            pZVar9->rep[0] = UVar12;
            *(undefined8 *)(&pZVar9->litlen + 2) = uVar8;
            pZVar22 = pZVar24 + uVar44;
            pZVar22->price = iVar15;
            pZVar22->off = UVar11;
            pZVar22->mlen = UVar13;
            pZVar22->litlen = UVar14;
            uVar44 = (ulong)(uVar45 - 1);
            uVar36 = (ulong)(uVar23 - uVar27);
            if (uVar27 > uVar23) {
              uVar36 = 0;
            }
          } while (uVar27 <= uVar23 && uVar23 - uVar27 != 0);
        }
        puVar16 = local_a0;
        if (uVar45 <= uVar21) {
          pZVar22 = (ZSTD_optimal_t *)(ulong)uVar45;
          do {
            uVar21 = pZVar24[(long)pZVar22].litlen;
            uVar44 = (ulong)uVar21;
            UVar12 = pZVar24[(long)pZVar22].mlen;
            if (UVar12 == 0) {
              if (pZVar22 != local_188) {
                __assert_fail("storePos == storeEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x49c4,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              puVar38 = (ulong *)(uVar44 + (long)puVar16);
            }
            else {
              puVar38 = (ulong *)((long)puVar16 + uVar44);
              if (iend < puVar38) {
                __assert_fail("anchor + llen <= iend",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x49c9,
                              "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                             );
              }
              UVar11 = pZVar24[(long)pZVar22].off;
              ZSTD_updateStats(local_b0,uVar21,(BYTE *)puVar16,UVar11,UVar12);
              if (local_150->maxNbSeq <=
                  (ulong)((long)local_150->sequences - (long)local_150->sequencesStart >> 3)) {
                __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x2038,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (0x20000 < local_150->maxNbLit) {
                __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203a,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              puVar19 = (ulong *)local_150->lit;
              if (local_150->litStart + local_150->maxNbLit < (BYTE *)((long)puVar19 + uVar44)) {
                __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203b,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
              if (local_40 < puVar38) {
                ZSTD_safecopyLiterals
                          ((BYTE *)puVar19,(BYTE *)puVar16,(BYTE *)puVar38,(BYTE *)local_40);
              }
              else {
                uVar36 = puVar16[1];
                *puVar19 = *puVar16;
                puVar19[1] = uVar36;
                if (0x10 < uVar21) {
                  pBVar26 = local_150->lit;
                  puVar38 = (ulong *)(pBVar26 + 0x10);
                  puVar19 = puVar16 + 2;
                  if (0xffffffffffffffe8 < (ulong)((long)puVar38 + (-8 - (long)puVar19))) {
                    __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1268,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  if (0xffffffffffffffe0 < (ulong)((long)puVar38 + (-0x10 - (long)puVar19))) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                  ,0x1270,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  uVar36 = puVar16[3];
                  *puVar38 = *puVar19;
                  *(ulong *)(pBVar26 + 0x18) = uVar36;
                  if (0x20 < uVar21) {
                    lVar20 = 0;
                    do {
                      puVar2 = (undefined8 *)((long)puVar16 + lVar20 + 0x20);
                      uVar8 = puVar2[1];
                      pBVar25 = pBVar26 + lVar20 + 0x20;
                      *(undefined8 *)pBVar25 = *puVar2;
                      *(undefined8 *)(pBVar25 + 8) = uVar8;
                      puVar2 = (undefined8 *)((long)puVar16 + lVar20 + 0x30);
                      uVar8 = puVar2[1];
                      *(undefined8 *)(pBVar25 + 0x10) = *puVar2;
                      *(undefined8 *)(pBVar25 + 0x18) = uVar8;
                      lVar20 = lVar20 + 0x20;
                    } while (pBVar25 + 0x20 < pBVar26 + uVar44);
                  }
                }
              }
              local_150->lit = local_150->lit + uVar44;
              if (0xffff < uVar21) {
                if (local_150->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x204d,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_150->longLengthID = 1;
                local_150->longLengthPos =
                     (U32)((ulong)((long)local_150->sequences - (long)local_150->sequencesStart) >>
                          3);
              }
              psVar4 = local_150->sequences;
              psVar4->litLength = (U16)uVar21;
              psVar4->offset = UVar11 + 1;
              if (0xffff < UVar12 - 3) {
                if (local_150->longLengthID != 0) {
                  __assert_fail("seqStorePtr->longLengthID == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                ,0x2058,
                                "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                               );
                }
                local_150->longLengthID = 2;
                local_150->longLengthPos =
                     (U32)((ulong)((long)psVar4 - (long)local_150->sequencesStart) >> 3);
              }
              psVar4->matchLength = (U16)(UVar12 - 3);
              local_150->sequences = psVar4 + 1;
              puVar16 = (ulong *)((long)puVar16 + (ulong)(UVar12 + uVar21));
              pZVar24 = local_f8;
              puVar38 = puVar16;
            }
            pZVar22 = (ZSTD_optimal_t *)((long)&pZVar22->price + 1);
          } while (pZVar22 != (ZSTD_optimal_t *)(ulong)(iVar17 + 2));
        }
        local_a0 = puVar16;
        ZSTD_setBasePrices(local_b0,2);
        psVar35 = local_150;
      }
      else if (iVar17 == 0) {
        if ((int)uVar44 != 0) {
          pZVar22 = (ZSTD_optimal_t *)0x1;
          do {
            optPtr = local_b0;
            if (0xfff < (uint)pZVar22) {
              __assert_fail("cur < ZSTD_OPT_NUM",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4928,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            uVar21 = (uint)pZVar22 - 1;
            local_188 = pZVar24 + uVar21;
            UVar12 = 1;
            if (pZVar24[uVar21].mlen == 0) {
              UVar12 = local_188->litlen + 1;
            }
            puVar16 = (ulong *)((long)puVar38 + (long)(pZVar22->rep + -4));
            iVar17 = local_188->price;
            local_100 = pZVar22;
            UVar11 = ZSTD_rawLiteralsCost
                               ((BYTE *)((long)puVar16 + -1),(U32)local_b0,(optState_t *)0x2,iVar17)
            ;
            UVar13 = ZSTD_litLengthPrice(UVar12,optPtr,2);
            UVar14 = ZSTD_litLengthPrice(UVar12 - 1,optPtr,2);
            iVar17 = (UVar13 + UVar11 + iVar17) - UVar14;
            if (999999999 < iVar17) {
              __assert_fail("price < 1000000000",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4931,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            pZVar24 = local_f8 + (long)pZVar22;
            if (iVar17 <= local_f8[(long)pZVar22].price) {
              pZVar24->off = 0;
              pZVar24->mlen = 0;
              pZVar24->litlen = UVar12;
              pZVar24->price = iVar17;
            }
            uVar21 = pZVar24->mlen;
            if ((uint)local_100 < uVar21) {
              __assert_fail("cur >= opt[cur].mlen",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x4947,
                            "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                           );
            }
            if (uVar21 == 0) {
              pZVar24->rep[2] = local_188->rep[2];
              *(undefined8 *)pZVar24->rep = *(undefined8 *)local_188->rep;
            }
            else {
              rVar52 = ZSTD_updateRep(local_f8[(uint)local_100 - uVar21].rep,pZVar24->off,
                                      (uint)(pZVar24->litlen == 0));
              *&pZVar24->rep = rVar52.rep;
            }
            pZVar22 = local_188;
            uVar21 = 0x13;
            if (puVar16 <= local_70) {
              if ((int)local_100 == (int)uVar44) {
                uVar21 = 0x11;
              }
              else {
                UVar12 = pZVar24->mlen;
                local_188 = (ZSTD_optimal_t *)((ulong)local_188 & 0xffffffff00000000);
                if (UVar12 == 0) {
                  local_188 = (ZSTD_optimal_t *)CONCAT44(SUB84(pZVar22,4),pZVar24->litlen);
                }
                local_e0 = (U32 *)CONCAT44(local_e0._4_4_,pZVar24->price);
                UVar11 = ZSTD_litLengthPrice(0,local_b0,2);
                pBVar26 = (ms->window).base;
                uVar36 = (ulong)ms->nextToUpdate;
                local_1e8._0_4_ = 0;
                local_194._4_8_ = pZVar24;
                if (pBVar26 + uVar36 <= puVar16) {
                  UVar13 = (ms->cParams).minMatch;
                  while( true ) {
                    uVar21 = (uint)uVar36;
                    uVar45 = (uint)((long)puVar16 - (long)pBVar26);
                    if (uVar45 <= uVar21) break;
                    UVar14 = ZSTD_insertBt1(ms,pBVar26 + uVar36,(BYTE *)iend,UVar13,0);
                    uVar36 = (ulong)(UVar14 + uVar21);
                    if (UVar14 + uVar21 <= uVar21) goto LAB_0015913e;
                  }
                  if ((ulong)((long)puVar16 - (long)pBVar26) >> 0x20 != 0) goto LAB_0015938b;
                  if ((ulong)((long)iend - (long)pBVar26) >> 0x20 != 0) goto LAB_001593aa;
                  ms->nextToUpdate = uVar45;
                  iVar17 = (int)puVar16;
                  if (UVar13 - 6 < 2) {
                    uVar36 = (ulong)(UVar12 != 0);
                    uVar21 = (ms->cParams).targetLength;
                    if (0xffe < uVar21) {
                      uVar21 = 0xfff;
                    }
                    local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar21);
                    local_120 = (ms->window).base;
                    uVar27 = iVar17 - (int)local_120;
                    uVar45 = 0;
                    local_c0 = *puVar16 * -0x30e4432340650000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU);
                    local_148 = (ulong *)ms->chainTable;
                    uVar42 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar23 = uVar27 - uVar42;
                    if (uVar27 < uVar42) {
                      uVar23 = uVar45;
                    }
                    local_138 = CONCAT44(local_138._4_4_,uVar23);
                    uVar23 = (ms->window).dictLimit;
                    uVar31 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    uVar32 = (ms->window).lowLimit;
                    uVar33 = uVar27 - uVar31;
                    if (uVar27 - uVar32 <= uVar31) {
                      uVar33 = uVar32;
                    }
                    if (ms->loadedDictEnd != 0) {
                      uVar33 = uVar32;
                    }
                    local_170 = (uint *)CONCAT44(local_170._4_4_,uVar33 + (uVar33 == 0));
                    local_110 = (ulong *)CONCAT44(local_110._4_4_,uVar42);
                    uVar39 = (ulong)((uVar42 & uVar27) * 2);
                    local_178 = (ulong *)((long)local_148 + uVar39 * 4);
                    local_168 = (ulong *)((long)local_148 + uVar39 * 4 + 4);
                    iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    lVar20 = -uVar36;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    puVar37 = (ulong *)(ulong)local_c8[local_c0];
                    local_b8 = puVar37;
                    local_104 = uVar27 + 8;
                    local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar27 + 9);
                    uVar39 = uVar36 + 3;
                    puVar19 = (ulong *)((long)puVar16 + 4);
                    local_118 = (ulong *)((long)puVar16 + 0xc);
                    pBVar26 = local_d0;
                    local_1e8._0_4_ = uVar27;
                    do {
                      if (uVar36 == 3) {
                        uVar42 = *(U32 *)(local_194._4_8_ + 0x10) - 1;
                      }
                      else {
                        uVar42 = ((U32 *)(local_194._4_8_ + 0x10))[uVar36];
                      }
                      if (uVar27 < uVar23) goto LAB_0015915d;
                      if (uVar42 - 1 < uVar27 - uVar23) {
                        if ((uint)*puVar16 != *(uint *)((long)puVar16 - (ulong)uVar42))
                        goto LAB_0015757d;
                        puVar46 = (ulong *)((long)puVar19 - (ulong)uVar42);
                        puVar43 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar48 = *puVar19 ^ *puVar46;
                          uVar34 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                            }
                          }
                          uVar34 = uVar34 >> 3 & 0x1fffffff;
                          iVar15 = (int)uVar34;
                          puVar43 = local_118;
                          if (*puVar46 == *puVar19) {
                            do {
                              puVar46 = puVar46 + 1;
                              if (puVar49 <= puVar43) goto LAB_00157584;
                              uVar48 = *puVar46;
                              uVar3 = *puVar43;
                              uVar5 = 0;
                              if ((uVar3 ^ uVar48) != 0) {
                                for (; ((uVar3 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                                }
                              }
                              puVar47 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar43);
                              puVar43 = puVar43 + 1;
                              if (uVar48 != uVar3) {
                                uVar34 = (long)puVar47 - (long)puVar19;
                                puVar43 = puVar47;
                              }
                              iVar15 = (int)uVar34;
                            } while (uVar48 == uVar3);
                          }
                        }
                        else {
LAB_00157584:
                          if ((puVar43 < local_128) && ((uint)*puVar46 == (uint)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar43 < local_130) && ((short)*puVar46 == (short)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar43 < iend) {
                            puVar43 = (ulong *)((long)puVar43 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar43));
                          }
                          iVar15 = (int)puVar43 - (int)puVar19;
                        }
                        pBVar25 = (BYTE *)(ulong)(iVar15 + 4);
                        local_140 = pBVar26;
                      }
                      else {
                        if (uVar27 < uVar33) goto LAB_0015917c;
LAB_0015757d:
                        pBVar25 = (BYTE *)0x0;
                      }
                      uVar42 = (uint)pBVar25;
                      bVar7 = true;
                      if (pBVar26 < pBVar25) {
                        local_158[uVar45].off = (int)lVar20 + (int)uVar36;
                        uVar32 = uVar45 + 1;
                        local_158[uVar45].len = uVar42;
                        bVar51 = (ulong *)((long)puVar16 + (long)pBVar25) != iend;
                        bVar7 = bVar51 && uVar42 <= uVar21;
                        pBVar26 = pBVar25;
                        uVar45 = uVar32;
                        if (!bVar51 || uVar42 > uVar21) {
                          local_1e8._0_4_ = uVar32;
                        }
                      }
                      if (!bVar7) break;
                      uVar36 = uVar36 + 1;
                      bVar50 = uVar36 < uVar39;
                    } while (bVar50);
                    if (!bVar50) {
                      local_c8[local_c0] = uVar27;
                      local_180 = (BYTE *)0x0;
                      pBVar25 = (BYTE *)0x0;
                      do {
                        bVar50 = iVar17 == 0;
                        iVar17 = iVar17 + -1;
                        if (bVar50) break;
                        uVar21 = (uint)puVar37;
                        if (uVar21 < (uint)local_170) break;
                        pBVar30 = local_180;
                        if (pBVar25 < local_180) {
                          pBVar30 = pBVar25;
                        }
                        if (uVar27 <= uVar21) goto LAB_0015919b;
                        if (pBVar30 + (long)puVar37 < (BYTE *)(ulong)uVar23) goto LAB_001591ba;
                        pBVar41 = (BYTE *)((long)puVar37 + (long)local_120);
                        if ((uVar23 <= uVar21) &&
                           (iVar15 = bcmp(pBVar41,puVar16,(size_t)pBVar30), iVar15 != 0))
                        goto LAB_00159274;
                        puVar19 = (ulong *)((long)puVar16 + (long)pBVar30);
                        puVar43 = (ulong *)(pBVar41 + (long)pBVar30);
                        puVar46 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar39 = *puVar19 ^ *puVar43;
                          uVar36 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                            }
                          }
                          pBVar40 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                          if (*puVar43 == *puVar19) {
                            do {
                              puVar46 = puVar46 + 1;
                              puVar43 = puVar43 + 1;
                              if (puVar49 <= puVar46) goto LAB_00157774;
                              uVar39 = *puVar46 ^ *puVar43;
                              uVar36 = 0;
                              if (uVar39 != 0) {
                                for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                                }
                              }
                              pBVar40 = (BYTE *)((long)puVar46 +
                                                ((uVar36 >> 3 & 0x1fffffff) - (long)puVar19));
                            } while (*puVar43 == *puVar46);
                          }
                        }
                        else {
LAB_00157774:
                          if ((puVar46 < local_128) && ((uint)*puVar43 == (uint)*puVar46)) {
                            puVar46 = (ulong *)((long)puVar46 + 4);
                            puVar43 = (ulong *)((long)puVar43 + 4);
                          }
                          if ((puVar46 < local_130) && ((short)*puVar43 == (short)*puVar46)) {
                            puVar46 = (ulong *)((long)puVar46 + 2);
                            puVar43 = (ulong *)((long)puVar43 + 2);
                          }
                          if (puVar46 < iend) {
                            puVar46 = (ulong *)((long)puVar46 +
                                               (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                          }
                          pBVar40 = (BYTE *)((long)puVar46 - (long)puVar19);
                        }
                        pBVar40 = pBVar40 + (long)pBVar30;
                        if (pBVar26 < pBVar40) {
                          if ((uint)local_160 < uVar21 || (uint)local_160 - uVar21 == 0)
                          goto LAB_00159293;
                          uVar42 = (uint)local_160;
                          if ((BYTE *)(ulong)((uint)local_160 - uVar21) < pBVar40) {
                            uVar42 = (U32)pBVar40 + uVar21;
                          }
                          local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar42);
                          local_158[uVar45].off = (uVar27 + 2) - uVar21;
                          local_158[uVar45].len = (U32)pBVar40;
                          uVar45 = uVar45 + 1;
                          bVar50 = false;
                          pBVar26 = pBVar40;
                          if ((pBVar40 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar16 + (long)pBVar40) != iend)) goto LAB_00157837;
                        }
                        else {
LAB_00157837:
                          puVar19 = (ulong *)((long)local_148 +
                                             (ulong)((uVar21 & (uint)local_110) * 2) * 4);
                          if (pBVar41[(long)pBVar40] < *(byte *)((long)puVar16 + (long)pBVar40)) {
                            *(uint *)local_178 = uVar21;
                            pBVar25 = pBVar40;
                            if ((uint)local_138 < uVar21) {
                              puVar19 = (ulong *)((long)puVar19 + 4);
                              local_178 = puVar19;
LAB_001578b1:
                              puVar37 = (ulong *)(ulong)(uint)*puVar19;
                              bVar50 = true;
                            }
                            else {
                              bVar50 = false;
                              local_178 = (ulong *)local_194;
                            }
                          }
                          else {
                            *(uint *)local_168 = uVar21;
                            local_180 = pBVar40;
                            local_168 = puVar19;
                            if ((uint)local_138 < uVar21) goto LAB_001578b1;
                            bVar50 = false;
                            local_168 = (ulong *)local_194;
                          }
                        }
                      } while (bVar50);
LAB_00158447:
                      *(uint *)local_168 = 0;
                      *(uint *)local_178 = 0;
                      if ((uint)local_160 <= local_104) goto LAB_00159407;
                      ms->nextToUpdate = (uint)local_160 - 8;
                      local_1e8._0_4_ = uVar45;
                    }
                  }
                  else if (UVar13 == 5) {
                    uVar36 = (ulong)(UVar12 != 0);
                    uVar21 = (ms->cParams).targetLength;
                    if (0xffe < uVar21) {
                      uVar21 = 0xfff;
                    }
                    local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar21);
                    local_120 = (ms->window).base;
                    uVar23 = iVar17 - (int)local_120;
                    local_c0 = *puVar16 * -0x30e4432345000000 >>
                               (-(char)(ms->cParams).hashLog & 0x3fU);
                    local_148 = (ulong *)ms->chainTable;
                    uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar45 = uVar23 - uVar27;
                    if (uVar23 < uVar27) {
                      uVar45 = 0;
                    }
                    local_138 = CONCAT44(local_138._4_4_,uVar45);
                    uVar42 = (ms->window).dictLimit;
                    uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    uVar45 = (ms->window).lowLimit;
                    uVar32 = uVar23 - uVar33;
                    if (uVar23 - uVar45 <= uVar33) {
                      uVar32 = uVar45;
                    }
                    if (ms->loadedDictEnd != 0) {
                      uVar32 = uVar45;
                    }
                    local_170 = (uint *)CONCAT44(local_170._4_4_,uVar32 + (uVar32 == 0));
                    local_110 = (ulong *)CONCAT44(local_110._4_4_,uVar27);
                    uVar39 = (ulong)((uVar27 & uVar23) * 2);
                    local_178 = (ulong *)((long)local_148 + uVar39 * 4);
                    local_168 = (ulong *)((long)local_148 + uVar39 * 4 + 4);
                    iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    lVar20 = -uVar36;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    puVar37 = (ulong *)(ulong)local_c8[local_c0];
                    local_b8 = puVar37;
                    local_104 = uVar23 + 8;
                    local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar23 + 9);
                    uVar39 = uVar36 + 3;
                    puVar19 = (ulong *)((long)puVar16 + 4);
                    local_118 = (ulong *)((long)puVar16 + 0xc);
                    pBVar26 = local_d0;
                    uVar27 = 0;
                    local_1e8._0_4_ = uVar23;
                    do {
                      if (uVar36 == 3) {
                        uVar45 = *(U32 *)(local_194._4_8_ + 0x10) - 1;
                      }
                      else {
                        uVar45 = ((U32 *)(local_194._4_8_ + 0x10))[uVar36];
                      }
                      if (uVar23 < uVar42) goto LAB_0015915d;
                      if (uVar45 - 1 < uVar23 - uVar42) {
                        if ((uint)*puVar16 != *(uint *)((long)puVar16 - (ulong)uVar45))
                        goto LAB_00157b30;
                        puVar46 = (ulong *)((long)puVar19 - (ulong)uVar45);
                        puVar43 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar48 = *puVar19 ^ *puVar46;
                          uVar34 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                            }
                          }
                          uVar34 = uVar34 >> 3 & 0x1fffffff;
                          iVar15 = (int)uVar34;
                          puVar43 = local_118;
                          if (*puVar46 == *puVar19) {
                            do {
                              puVar46 = puVar46 + 1;
                              if (puVar49 <= puVar43) goto LAB_00157b37;
                              uVar48 = *puVar46;
                              uVar3 = *puVar43;
                              uVar5 = 0;
                              if ((uVar3 ^ uVar48) != 0) {
                                for (; ((uVar3 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                                }
                              }
                              puVar47 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar43);
                              puVar43 = puVar43 + 1;
                              if (uVar48 != uVar3) {
                                uVar34 = (long)puVar47 - (long)puVar19;
                                puVar43 = puVar47;
                              }
                              iVar15 = (int)uVar34;
                            } while (uVar48 == uVar3);
                          }
                        }
                        else {
LAB_00157b37:
                          if ((puVar43 < local_128) && ((uint)*puVar46 == (uint)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar43 < local_130) && ((short)*puVar46 == (short)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar43 < iend) {
                            puVar43 = (ulong *)((long)puVar43 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar43));
                          }
                          iVar15 = (int)puVar43 - (int)puVar19;
                        }
                        pBVar25 = (BYTE *)(ulong)(iVar15 + 4);
                        local_140 = pBVar26;
                      }
                      else {
                        if (uVar23 < uVar32) goto LAB_0015917c;
LAB_00157b30:
                        pBVar25 = (BYTE *)0x0;
                      }
                      uVar33 = (uint)pBVar25;
                      bVar7 = true;
                      uVar45 = uVar27;
                      if (pBVar26 < pBVar25) {
                        local_158[uVar27].off = (int)lVar20 + (int)uVar36;
                        uVar45 = uVar27 + 1;
                        local_158[uVar27].len = uVar33;
                        bVar51 = (ulong *)((long)puVar16 + (long)pBVar25) != iend;
                        bVar7 = bVar51 && uVar33 <= uVar21;
                        pBVar26 = pBVar25;
                        if (!bVar51 || uVar33 > uVar21) {
                          local_1e8._0_4_ = uVar45;
                        }
                      }
                      if (!bVar7) break;
                      uVar36 = uVar36 + 1;
                      bVar50 = uVar36 < uVar39;
                      uVar27 = uVar45;
                    } while (bVar50);
                    if (!bVar50) {
                      local_c8[local_c0] = uVar23;
                      local_180 = (BYTE *)0x0;
                      pBVar25 = (BYTE *)0x0;
                      do {
                        bVar50 = iVar17 == 0;
                        iVar17 = iVar17 + -1;
                        if (bVar50) break;
                        uVar21 = (uint)puVar37;
                        if (uVar21 < (uint)local_170) break;
                        pBVar30 = local_180;
                        if (pBVar25 < local_180) {
                          pBVar30 = pBVar25;
                        }
                        if (uVar23 <= uVar21) goto LAB_0015919b;
                        if (pBVar30 + (long)puVar37 < (BYTE *)(ulong)uVar42) goto LAB_001591ba;
                        pBVar41 = (BYTE *)((long)puVar37 + (long)local_120);
                        if ((uVar42 <= uVar21) &&
                           (iVar15 = bcmp(pBVar41,puVar16,(size_t)pBVar30), iVar15 != 0))
                        goto LAB_00159274;
                        puVar19 = (ulong *)((long)puVar16 + (long)pBVar30);
                        puVar43 = (ulong *)(pBVar41 + (long)pBVar30);
                        puVar46 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar39 = *puVar19 ^ *puVar43;
                          uVar36 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                            }
                          }
                          pBVar40 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                          if (*puVar43 == *puVar19) {
                            do {
                              puVar46 = puVar46 + 1;
                              puVar43 = puVar43 + 1;
                              if (puVar49 <= puVar46) goto LAB_00157d27;
                              uVar39 = *puVar46 ^ *puVar43;
                              uVar36 = 0;
                              if (uVar39 != 0) {
                                for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                                }
                              }
                              pBVar40 = (BYTE *)((long)puVar46 +
                                                ((uVar36 >> 3 & 0x1fffffff) - (long)puVar19));
                            } while (*puVar43 == *puVar46);
                          }
                        }
                        else {
LAB_00157d27:
                          if ((puVar46 < local_128) && ((uint)*puVar43 == (uint)*puVar46)) {
                            puVar46 = (ulong *)((long)puVar46 + 4);
                            puVar43 = (ulong *)((long)puVar43 + 4);
                          }
                          if ((puVar46 < local_130) && ((short)*puVar43 == (short)*puVar46)) {
                            puVar46 = (ulong *)((long)puVar46 + 2);
                            puVar43 = (ulong *)((long)puVar43 + 2);
                          }
                          if (puVar46 < iend) {
                            puVar46 = (ulong *)((long)puVar46 +
                                               (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                          }
                          pBVar40 = (BYTE *)((long)puVar46 - (long)puVar19);
                        }
                        pBVar40 = pBVar40 + (long)pBVar30;
                        if (pBVar26 < pBVar40) {
                          if ((uint)local_160 < uVar21 || (uint)local_160 - uVar21 == 0)
                          goto LAB_00159293;
                          uVar27 = (uint)local_160;
                          if ((BYTE *)(ulong)((uint)local_160 - uVar21) < pBVar40) {
                            uVar27 = (U32)pBVar40 + uVar21;
                          }
                          local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar27);
                          local_158[uVar45].off = (uVar23 + 2) - uVar21;
                          local_158[uVar45].len = (U32)pBVar40;
                          uVar45 = uVar45 + 1;
                          bVar50 = false;
                          pBVar26 = pBVar40;
                          if ((pBVar40 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar16 + (long)pBVar40) != iend)) goto LAB_00157dea;
                        }
                        else {
LAB_00157dea:
                          puVar19 = (ulong *)((long)local_148 +
                                             (ulong)((uVar21 & (uint)local_110) * 2) * 4);
                          if (pBVar41[(long)pBVar40] < *(byte *)((long)puVar16 + (long)pBVar40)) {
                            *(uint *)local_178 = uVar21;
                            pBVar25 = pBVar40;
                            if ((uint)local_138 < uVar21) {
                              puVar19 = (ulong *)((long)puVar19 + 4);
                              local_178 = puVar19;
LAB_00157e64:
                              puVar37 = (ulong *)(ulong)(uint)*puVar19;
                              bVar50 = true;
                            }
                            else {
                              bVar50 = false;
                              local_178 = (ulong *)local_194;
                            }
                          }
                          else {
                            *(uint *)local_168 = uVar21;
                            local_180 = pBVar40;
                            local_168 = puVar19;
                            if ((uint)local_138 < uVar21) goto LAB_00157e64;
                            bVar50 = false;
                            local_168 = (ulong *)local_194;
                          }
                        }
                      } while (bVar50);
                      goto LAB_00158447;
                    }
                  }
                  else if (UVar13 == 3) {
                    uVar36 = (ulong)(UVar12 != 0);
                    uVar21 = (ms->cParams).targetLength;
                    if (0xffe < uVar21) {
                      uVar21 = 0xfff;
                    }
                    local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar21);
                    local_168 = (ulong *)(ms->window).base;
                    uVar23 = iVar17 - (int)local_168;
                    uVar45 = 0;
                    local_c0 = (ulong)((uint)*puVar16 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
                    local_110 = (ulong *)ms->chainTable;
                    uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    iVar17 = uVar23 - uVar27;
                    if (uVar23 < uVar27) {
                      iVar17 = 0;
                    }
                    local_118 = (ulong *)CONCAT44(local_118._4_4_,iVar17);
                    uVar42 = (ms->window).dictLimit;
                    uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    UVar12 = (ms->window).lowLimit;
                    UVar13 = uVar23 - uVar32;
                    if (uVar23 - UVar12 <= uVar32) {
                      UVar13 = UVar12;
                    }
                    if (ms->loadedDictEnd != 0) {
                      UVar13 = UVar12;
                    }
                    local_140 = (BYTE *)CONCAT44(local_140._4_4_,UVar13 + (UVar13 == 0));
                    local_138 = CONCAT44(local_138._4_4_,uVar27);
                    uVar39 = (ulong)((uVar27 & uVar23) * 2);
                    local_148 = (ulong *)((long)local_110 + uVar39 * 4);
                    local_178 = (ulong *)((long)local_110 + uVar39 * 4 + 4);
                    local_180 = (BYTE *)CONCAT44(local_180._4_4_,
                                                 1 << ((byte)(ms->cParams).searchLog & 0x1f));
                    local_170 = (uint *)-uVar36;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    UVar12 = ms->hashTable[local_c0];
                    local_104 = uVar23 + 8;
                    local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar23 + 9);
                    uVar39 = uVar36 + 3;
                    puVar19 = (ulong *)((long)puVar16 + 3);
                    local_b8 = (ulong *)((long)puVar16 + 0xb);
                    local_1e0 = local_d0;
                    local_1e8 = local_b8;
                    do {
                      if (uVar36 == 3) {
                        UVar14 = *(U32 *)(local_194._4_8_ + 0x10) - 1;
                      }
                      else {
                        UVar14 = ((U32 *)(local_194._4_8_ + 0x10))[uVar36];
                      }
                      if (uVar23 < uVar42) goto LAB_0015915d;
                      if (UVar14 - 1 < uVar23 - uVar42) {
                        if (((*(uint *)((long)puVar16 - (ulong)UVar14) ^ (uint)*puVar16) & 0xffffff)
                            != 0) goto LAB_00157250;
                        puVar43 = (ulong *)((long)puVar19 - (ulong)UVar14);
                        puVar37 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar48 = *puVar19 ^ *puVar43;
                          uVar34 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                            }
                          }
                          uVar34 = uVar34 >> 3 & 0x1fffffff;
                          iVar17 = (int)uVar34;
                          puVar37 = local_b8;
                          if (*puVar43 == *puVar19) {
                            do {
                              puVar43 = puVar43 + 1;
                              if (puVar49 <= puVar37) goto LAB_001572d4;
                              uVar48 = *puVar43;
                              uVar3 = *puVar37;
                              uVar5 = 0;
                              if ((uVar3 ^ uVar48) != 0) {
                                for (; ((uVar3 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                                }
                              }
                              puVar46 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar37);
                              puVar37 = puVar37 + 1;
                              if (uVar48 != uVar3) {
                                uVar34 = (long)puVar46 - (long)puVar19;
                                puVar37 = puVar46;
                              }
                              iVar17 = (int)uVar34;
                            } while (uVar48 == uVar3);
                          }
                        }
                        else {
LAB_001572d4:
                          if ((puVar37 < local_128) && ((uint)*puVar43 == (uint)*puVar37)) {
                            puVar37 = (ulong *)((long)puVar37 + 4);
                            puVar43 = (ulong *)((long)puVar43 + 4);
                          }
                          if ((puVar37 < local_130) && ((short)*puVar43 == (short)*puVar37)) {
                            puVar37 = (ulong *)((long)puVar37 + 2);
                            puVar43 = (ulong *)((long)puVar43 + 2);
                          }
                          if (puVar37 < iend) {
                            puVar37 = (ulong *)((long)puVar37 +
                                               (ulong)((BYTE)*puVar43 == (BYTE)*puVar37));
                          }
                          iVar17 = (int)puVar37 - (int)puVar19;
                        }
                        pBVar26 = (BYTE *)(ulong)(iVar17 + 3);
                      }
                      else {
                        if (uVar23 < UVar13) goto LAB_0015917c;
LAB_00157250:
                        pBVar26 = (BYTE *)0x0;
                      }
                      uVar27 = (uint)pBVar26;
                      bVar7 = true;
                      if (local_1e0 < pBVar26) {
                        local_158[uVar45].off = (int)local_170 + (int)uVar36;
                        uVar32 = uVar45 + 1;
                        local_158[uVar45].len = uVar27;
                        bVar51 = (ulong *)((long)puVar16 + (long)pBVar26) != iend;
                        bVar7 = bVar51 && uVar27 <= uVar21;
                        local_1e8 = (ulong *)((ulong)local_1e8 & 0xffffffff);
                        uVar45 = uVar32;
                        local_1e0 = pBVar26;
                        if (!bVar51 || uVar27 > uVar21) {
                          local_1e8 = (ulong *)(ulong)uVar32;
                        }
                      }
                      if (!bVar7) break;
                      uVar36 = uVar36 + 1;
                      bVar50 = uVar36 < uVar39;
                    } while (bVar50);
                    if (!bVar50) {
                      if (local_1e0 < (BYTE *)0x3) {
                        UVar13 = ZSTD_insertAndFindFirstIndexHash3(ms,&local_8c,(BYTE *)puVar16);
                        bVar50 = true;
                        if (((uint)local_140 <= UVar13) && (uVar23 - UVar13 < 0x40000)) {
                          puVar37 = (ulong *)((ulong)UVar13 + (long)local_168);
                          puVar19 = puVar16;
                          if (puVar16 < puVar49) {
                            uVar39 = *puVar16 ^ *puVar37;
                            uVar36 = 0;
                            if (uVar39 != 0) {
                              for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                              }
                            }
                            pBVar26 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                            if (*puVar37 == *puVar16) {
                              do {
                                puVar19 = puVar19 + 1;
                                puVar37 = puVar37 + 1;
                                if (puVar49 <= puVar19) goto LAB_0015856f;
                                uVar39 = *puVar19 ^ *puVar37;
                                uVar36 = 0;
                                if (uVar39 != 0) {
                                  for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                                  }
                                }
                                pBVar26 = (BYTE *)((long)puVar19 +
                                                  ((uVar36 >> 3 & 0x1fffffff) - (long)puVar16));
                              } while (*puVar37 == *puVar19);
                            }
                          }
                          else {
LAB_0015856f:
                            if ((puVar19 < local_128) && ((uint)*puVar37 == (uint)*puVar19)) {
                              puVar19 = (ulong *)((long)puVar19 + 4);
                              puVar37 = (ulong *)((long)puVar37 + 4);
                            }
                            if ((puVar19 < local_130) && ((short)*puVar37 == (short)*puVar19)) {
                              puVar19 = (ulong *)((long)puVar19 + 2);
                              puVar37 = (ulong *)((long)puVar37 + 2);
                            }
                            if (puVar19 < iend) {
                              puVar19 = (ulong *)((long)puVar19 +
                                                 (ulong)((BYTE)*puVar37 == (BYTE)*puVar19));
                            }
                            pBVar26 = (BYTE *)((long)puVar19 - (long)puVar16);
                          }
                          if ((BYTE *)0x2 < pBVar26) {
                            if (uVar23 <= UVar13) goto LAB_001594c1;
                            if (uVar45 != 0) goto LAB_001594e0;
                            local_158->off = (uVar23 - UVar13) + 2;
                            local_158->len = (U32)pBVar26;
                            local_1e0 = pBVar26;
                            if (((BYTE *)((ulong)local_160 & 0xffffffff) < pBVar26) ||
                               (uVar45 = 1, (ulong *)((long)puVar16 + (long)pBVar26) == iend)) {
                              ms->nextToUpdate = uVar23 + 1;
                              uVar45 = 1;
                              bVar50 = false;
                              local_1e8._0_4_ = 1;
                            }
                          }
                        }
                        if (!bVar50) goto LAB_0015891f;
                      }
                      local_c8[local_c0] = uVar23;
                      local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar23 + 2);
                      local_1e8 = (ulong *)(ulong)uVar45;
                      local_1a0 = (BYTE *)0x0;
                      pBVar26 = (BYTE *)0x0;
                      do {
                        if (((uint)local_180 == 0) || (UVar12 < (uint)local_140)) break;
                        pBVar25 = local_1a0;
                        if (pBVar26 < local_1a0) {
                          pBVar25 = pBVar26;
                        }
                        if (uVar23 <= UVar12) goto LAB_0015919b;
                        local_180 = (BYTE *)CONCAT44(local_180._4_4_,(uint)local_180 + -1);
                        if (pBVar25 + UVar12 < (BYTE *)(ulong)uVar42) goto LAB_001591ba;
                        pBVar30 = (BYTE *)((ulong)UVar12 + (long)local_168);
                        if ((uVar42 <= UVar12) &&
                           (iVar17 = bcmp(pBVar30,puVar16,(size_t)pBVar25), iVar17 != 0))
                        goto LAB_00159274;
                        puVar19 = (ulong *)((long)puVar16 + (long)pBVar25);
                        puVar37 = (ulong *)(pBVar30 + (long)pBVar25);
                        puVar43 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar39 = *puVar19 ^ *puVar37;
                          uVar36 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                            }
                          }
                          pBVar41 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                          if (*puVar37 == *puVar19) {
                            do {
                              puVar43 = puVar43 + 1;
                              puVar37 = puVar37 + 1;
                              if (puVar49 <= puVar43) goto LAB_00158758;
                              uVar39 = *puVar43 ^ *puVar37;
                              uVar36 = 0;
                              if (uVar39 != 0) {
                                for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                                }
                              }
                              pBVar41 = (BYTE *)((long)puVar43 +
                                                ((uVar36 >> 3 & 0x1fffffff) - (long)puVar19));
                            } while (*puVar37 == *puVar43);
                          }
                        }
                        else {
LAB_00158758:
                          if ((puVar43 < local_128) && ((uint)*puVar37 == (uint)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 4);
                            puVar37 = (ulong *)((long)puVar37 + 4);
                          }
                          if ((puVar43 < local_130) && ((short)*puVar37 == (short)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 2);
                            puVar37 = (ulong *)((long)puVar37 + 2);
                          }
                          if (puVar43 < iend) {
                            puVar43 = (ulong *)((long)puVar43 +
                                               (ulong)((BYTE)*puVar37 == (BYTE)*puVar43));
                          }
                          pBVar41 = (BYTE *)((long)puVar43 - (long)puVar19);
                        }
                        pBVar41 = pBVar41 + (long)pBVar25;
                        if (local_1e0 < pBVar41) {
                          if ((uint)local_120 < UVar12 || (uint)local_120 - UVar12 == 0)
                          goto LAB_00159293;
                          uVar21 = (uint)local_120;
                          if ((BYTE *)(ulong)((uint)local_120 - UVar12) < pBVar41) {
                            uVar21 = UVar12 + (U32)pBVar41;
                          }
                          local_120 = (BYTE *)CONCAT44(local_120._4_4_,uVar21);
                          local_158[(long)local_1e8].off = (uint)local_160 - UVar12;
                          local_158[(long)local_1e8].len = (U32)pBVar41;
                          local_1e8 = (ulong *)(ulong)((uint)local_1e8 + 1);
                          bVar50 = false;
                          local_1e0 = pBVar41;
                          if (pBVar41 < (BYTE *)0x1001) {
                            if ((ulong *)((long)puVar16 + (long)pBVar41) != iend) goto LAB_00158833;
LAB_001588c8:
                            bVar50 = false;
                          }
                        }
                        else {
LAB_00158833:
                          puVar19 = (ulong *)((long)local_110 +
                                             (ulong)((UVar12 & (uint)local_138) * 2) * 4);
                          if (pBVar30[(long)pBVar41] < *(byte *)((long)puVar16 + (long)pBVar41)) {
                            *(U32 *)local_148 = UVar12;
                            pBVar26 = pBVar41;
                            if (UVar12 <= (uint)local_118) {
                              bVar50 = false;
                              local_148 = (ulong *)local_194;
                              goto LAB_001588da;
                            }
                            puVar19 = (ulong *)((long)puVar19 + 4);
                            local_148 = puVar19;
                          }
                          else {
                            *(U32 *)local_178 = UVar12;
                            local_1a0 = pBVar41;
                            local_178 = puVar19;
                            if (UVar12 <= (uint)local_118) {
                              local_178 = (ulong *)local_194;
                              goto LAB_001588c8;
                            }
                          }
                          UVar12 = (U32)*puVar19;
                          bVar50 = true;
                        }
LAB_001588da:
                      } while (bVar50);
                      *(uint *)local_178 = 0;
                      *(uint *)local_148 = 0;
                      if ((uint)local_120 <= local_104) goto LAB_00159407;
                      ms->nextToUpdate = (uint)local_120 - 8;
                    }
                  }
                  else {
                    uVar36 = (ulong)(UVar12 != 0);
                    uVar21 = (ms->cParams).targetLength;
                    if (0xffe < uVar21) {
                      uVar21 = 0xfff;
                    }
                    local_180 = (BYTE *)CONCAT44(local_180._4_4_,uVar21);
                    local_120 = (ms->window).base;
                    uVar23 = iVar17 - (int)local_120;
                    local_c0 = (ulong)((uint)*puVar16 * -0x61c8864f >>
                                      (-(char)(ms->cParams).hashLog & 0x1fU));
                    local_148 = (ulong *)ms->chainTable;
                    uVar27 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
                    uVar45 = uVar23 - uVar27;
                    if (uVar23 < uVar27) {
                      uVar45 = 0;
                    }
                    local_138 = CONCAT44(local_138._4_4_,uVar45);
                    uVar42 = (ms->window).dictLimit;
                    uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
                    uVar45 = (ms->window).lowLimit;
                    uVar32 = uVar23 - uVar33;
                    if (uVar23 - uVar45 <= uVar33) {
                      uVar32 = uVar45;
                    }
                    if (ms->loadedDictEnd != 0) {
                      uVar32 = uVar45;
                    }
                    local_170 = (uint *)CONCAT44(local_170._4_4_,uVar32 + (uVar32 == 0));
                    local_110 = (ulong *)CONCAT44(local_110._4_4_,uVar27);
                    uVar39 = (ulong)((uVar27 & uVar23) * 2);
                    local_178 = (ulong *)((long)local_148 + uVar39 * 4);
                    local_168 = (ulong *)((long)local_148 + uVar39 * 4 + 4);
                    iVar17 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
                    lVar20 = -uVar36;
                    bVar50 = true;
                    local_c8 = ms->hashTable;
                    puVar37 = (ulong *)(ulong)local_c8[local_c0];
                    local_b8 = puVar37;
                    local_104 = uVar23 + 8;
                    local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar23 + 9);
                    uVar39 = uVar36 + 3;
                    puVar19 = (ulong *)((long)puVar16 + 4);
                    local_118 = (ulong *)((long)puVar16 + 0xc);
                    pBVar26 = local_d0;
                    uVar27 = 0;
                    local_1e8._0_4_ = uVar23;
                    do {
                      if (uVar36 == 3) {
                        uVar45 = *(U32 *)(local_194._4_8_ + 0x10) - 1;
                      }
                      else {
                        uVar45 = ((U32 *)(local_194._4_8_ + 0x10))[uVar36];
                      }
                      if (uVar23 < uVar42) goto LAB_0015915d;
                      if (uVar45 - 1 < uVar23 - uVar42) {
                        if ((uint)*puVar16 != *(uint *)((long)puVar16 - (ulong)uVar45))
                        goto LAB_001580d7;
                        puVar46 = (ulong *)((long)puVar19 - (ulong)uVar45);
                        puVar43 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar48 = *puVar19 ^ *puVar46;
                          uVar34 = 0;
                          if (uVar48 != 0) {
                            for (; (uVar48 >> uVar34 & 1) == 0; uVar34 = uVar34 + 1) {
                            }
                          }
                          uVar34 = uVar34 >> 3 & 0x1fffffff;
                          iVar15 = (int)uVar34;
                          puVar43 = local_118;
                          if (*puVar46 == *puVar19) {
                            do {
                              puVar46 = puVar46 + 1;
                              if (puVar49 <= puVar43) goto LAB_001580de;
                              uVar48 = *puVar46;
                              uVar3 = *puVar43;
                              uVar5 = 0;
                              if ((uVar3 ^ uVar48) != 0) {
                                for (; ((uVar3 ^ uVar48) >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                                }
                              }
                              puVar47 = (ulong *)((uVar5 >> 3 & 0x1fffffff) + (long)puVar43);
                              puVar43 = puVar43 + 1;
                              if (uVar48 != uVar3) {
                                uVar34 = (long)puVar47 - (long)puVar19;
                                puVar43 = puVar47;
                              }
                              iVar15 = (int)uVar34;
                            } while (uVar48 == uVar3);
                          }
                        }
                        else {
LAB_001580de:
                          if ((puVar43 < local_128) && ((uint)*puVar46 == (uint)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 4);
                            puVar46 = (ulong *)((long)puVar46 + 4);
                          }
                          if ((puVar43 < local_130) && ((short)*puVar46 == (short)*puVar43)) {
                            puVar43 = (ulong *)((long)puVar43 + 2);
                            puVar46 = (ulong *)((long)puVar46 + 2);
                          }
                          if (puVar43 < iend) {
                            puVar43 = (ulong *)((long)puVar43 +
                                               (ulong)((BYTE)*puVar46 == (BYTE)*puVar43));
                          }
                          iVar15 = (int)puVar43 - (int)puVar19;
                        }
                        pBVar25 = (BYTE *)(ulong)(iVar15 + 4);
                        local_140 = pBVar26;
                      }
                      else {
                        if (uVar23 < uVar32) goto LAB_0015917c;
LAB_001580d7:
                        pBVar25 = (BYTE *)0x0;
                      }
                      uVar33 = (uint)pBVar25;
                      bVar7 = true;
                      uVar45 = uVar27;
                      if (pBVar26 < pBVar25) {
                        local_158[uVar27].off = (int)lVar20 + (int)uVar36;
                        uVar45 = uVar27 + 1;
                        local_158[uVar27].len = uVar33;
                        bVar51 = (ulong *)((long)puVar16 + (long)pBVar25) != iend;
                        bVar7 = bVar51 && uVar33 <= uVar21;
                        pBVar26 = pBVar25;
                        if (!bVar51 || uVar33 > uVar21) {
                          local_1e8._0_4_ = uVar45;
                        }
                      }
                      if (!bVar7) break;
                      uVar36 = uVar36 + 1;
                      bVar50 = uVar36 < uVar39;
                      uVar27 = uVar45;
                    } while (bVar50);
                    if (!bVar50) {
                      local_c8[local_c0] = uVar23;
                      local_180 = (BYTE *)0x0;
                      pBVar25 = (BYTE *)0x0;
                      do {
                        bVar50 = iVar17 == 0;
                        iVar17 = iVar17 + -1;
                        if (bVar50) break;
                        uVar21 = (uint)puVar37;
                        if (uVar21 < (uint)local_170) break;
                        pBVar30 = local_180;
                        if (pBVar25 < local_180) {
                          pBVar30 = pBVar25;
                        }
                        if (uVar23 <= uVar21) goto LAB_0015919b;
                        if (pBVar30 + (long)puVar37 < (BYTE *)(ulong)uVar42) goto LAB_001591ba;
                        pBVar41 = (BYTE *)((long)puVar37 + (long)local_120);
                        if ((uVar42 <= uVar21) &&
                           (iVar15 = bcmp(pBVar41,puVar16,(size_t)pBVar30), iVar15 != 0))
                        goto LAB_00159274;
                        puVar19 = (ulong *)((long)puVar16 + (long)pBVar30);
                        puVar43 = (ulong *)(pBVar41 + (long)pBVar30);
                        puVar46 = puVar19;
                        if (puVar19 < puVar49) {
                          uVar39 = *puVar19 ^ *puVar43;
                          uVar36 = 0;
                          if (uVar39 != 0) {
                            for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                            }
                          }
                          pBVar40 = (BYTE *)(uVar36 >> 3 & 0x1fffffff);
                          if (*puVar43 == *puVar19) {
                            do {
                              puVar46 = puVar46 + 1;
                              puVar43 = puVar43 + 1;
                              if (puVar49 <= puVar46) goto LAB_001582ce;
                              uVar39 = *puVar46 ^ *puVar43;
                              uVar36 = 0;
                              if (uVar39 != 0) {
                                for (; (uVar39 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                                }
                              }
                              pBVar40 = (BYTE *)((long)puVar46 +
                                                ((uVar36 >> 3 & 0x1fffffff) - (long)puVar19));
                            } while (*puVar43 == *puVar46);
                          }
                        }
                        else {
LAB_001582ce:
                          if ((puVar46 < local_128) && ((uint)*puVar43 == (uint)*puVar46)) {
                            puVar46 = (ulong *)((long)puVar46 + 4);
                            puVar43 = (ulong *)((long)puVar43 + 4);
                          }
                          if ((puVar46 < local_130) && ((short)*puVar43 == (short)*puVar46)) {
                            puVar46 = (ulong *)((long)puVar46 + 2);
                            puVar43 = (ulong *)((long)puVar43 + 2);
                          }
                          if (puVar46 < iend) {
                            puVar46 = (ulong *)((long)puVar46 +
                                               (ulong)((BYTE)*puVar43 == (BYTE)*puVar46));
                          }
                          pBVar40 = (BYTE *)((long)puVar46 - (long)puVar19);
                        }
                        pBVar40 = pBVar40 + (long)pBVar30;
                        if (pBVar26 < pBVar40) {
                          if ((uint)local_160 < uVar21 || (uint)local_160 - uVar21 == 0)
                          goto LAB_00159293;
                          uVar27 = (uint)local_160;
                          if ((BYTE *)(ulong)((uint)local_160 - uVar21) < pBVar40) {
                            uVar27 = (U32)pBVar40 + uVar21;
                          }
                          local_160 = (BYTE *)CONCAT44(local_160._4_4_,uVar27);
                          local_158[uVar45].off = (uVar23 + 2) - uVar21;
                          local_158[uVar45].len = (U32)pBVar40;
                          uVar45 = uVar45 + 1;
                          bVar50 = false;
                          pBVar26 = pBVar40;
                          if ((pBVar40 < (BYTE *)0x1001) &&
                             ((ulong *)((long)puVar16 + (long)pBVar40) != iend)) goto LAB_00158391;
                        }
                        else {
LAB_00158391:
                          puVar19 = (ulong *)((long)local_148 +
                                             (ulong)((uVar21 & (uint)local_110) * 2) * 4);
                          if (pBVar41[(long)pBVar40] < *(byte *)((long)puVar16 + (long)pBVar40)) {
                            *(uint *)local_178 = uVar21;
                            pBVar25 = pBVar40;
                            if ((uint)local_138 < uVar21) {
                              puVar19 = (ulong *)((long)puVar19 + 4);
                              local_178 = puVar19;
LAB_0015840b:
                              puVar37 = (ulong *)(ulong)(uint)*puVar19;
                              bVar50 = true;
                            }
                            else {
                              bVar50 = false;
                              local_178 = (ulong *)local_194;
                            }
                          }
                          else {
                            *(uint *)local_168 = uVar21;
                            local_180 = pBVar40;
                            local_168 = puVar19;
                            if ((uint)local_138 < uVar21) goto LAB_0015840b;
                            bVar50 = false;
                            local_168 = (ulong *)local_194;
                          }
                        }
                      } while (bVar50);
                      goto LAB_00158447;
                    }
                  }
                }
LAB_0015891f:
                if ((uint)local_1e8 == 0) {
                  uVar21 = 0x13;
                }
                else {
                  uVar45 = local_158[(uint)local_1e8 - 1].len;
                  bVar50 = 0xfff < (int)local_100 + uVar45;
                  uVar21 = 0;
                  if (bVar50 || local_a4 < uVar45) {
                    UVar12 = 0;
                    if (*(U32 *)(local_194._4_8_ + 8) == 0) {
                      UVar12 = *(U32 *)(local_194._4_8_ + 0xc);
                    }
                    uVar21 = (int)local_100 - UVar12;
                    uVar44 = (ulong)(uVar45 + (uint)local_188 + uVar21);
                    if (0x1000 < uVar21) {
                      uVar21 = 0;
                    }
                    local_100 = (ZSTD_optimal_t *)(ulong)uVar21;
                    local_d4 = local_158[(uint)local_1e8 - 1].off;
                    uVar21 = 7;
                    local_88 = (ZSTD_optimal_t *)(ulong)uVar45;
                    local_98 = (ZSTD_optimal_t *)((ulong)local_188 & 0xffffffff);
                  }
                  if (!bVar50 && local_a4 >= uVar45) {
                    uVar36 = 0;
                    do {
                      uVar21 = (uint)local_38;
                      if (uVar36 != 0) {
                        uVar21 = local_158[uVar36 - 1].len + 1;
                      }
                      uVar39 = (ulong)local_158[uVar36].len;
                      if (uVar21 <= local_158[uVar36].len) {
                        UVar12 = local_158[uVar36].off;
                        if (UVar12 == 0xffffffff) goto LAB_00159100;
                        uVar45 = 0x1f;
                        if (UVar12 + 1 != 0) {
                          for (; UVar12 + 1 >> uVar45 == 0; uVar45 = uVar45 - 1) {
                          }
                        }
                        do {
                          if (uVar39 < 3) goto LAB_0015911f;
                          UVar13 = (U32)uVar39;
                          if ((ms->opt).priceType == zop_predef) {
                            uVar27 = UVar13 - 2;
                            uVar23 = 0x1f;
                            if (uVar27 != 0) {
                              for (; uVar27 >> uVar23 == 0; uVar23 = uVar23 - 1) {
                              }
                            }
                            if (0x16 < uVar23) goto LAB_001590e1;
                            iVar17 = (uVar27 * 0x100 >> ((byte)uVar23 & 0x1f)) +
                                     (uVar23 + uVar45) * 0x100 + 0x1000;
                          }
                          else {
                            uVar23 = (ms->opt).offCodeFreq[uVar45] + 1;
                            if (uVar23 == 0) goto LAB_00159100;
                            uVar27 = 0x1f;
                            if (uVar23 != 0) {
                              for (; uVar23 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                              }
                            }
                            if (0x16 < uVar27) goto LAB_001590e1;
                            uVar42 = UVar13 - 3;
                            if (uVar42 < 0x80) {
                              uVar42 = (uint)(byte)(&ZSTD_MLcode(unsigned_int)::ML_Code)[uVar42];
                            }
                            else {
                              uVar32 = 0x1f;
                              if (uVar42 != 0) {
                                for (; uVar42 >> uVar32 == 0; uVar32 = uVar32 - 1) {
                                }
                              }
                              uVar42 = (uVar32 ^ 0xffffffe0) + 0x44;
                            }
                            uVar32 = (ms->opt).matchLengthFreq[uVar42] + 1;
                            if (uVar32 == 0) goto LAB_00159100;
                            uVar33 = 0x1f;
                            if (uVar32 != 0) {
                              for (; uVar32 >> uVar33 == 0; uVar33 = uVar33 - 1) {
                              }
                            }
                            if (0x16 < uVar33) goto LAB_001590e1;
                            iVar17 = (((ms->opt).matchLengthSumBasePrice +
                                      (ms->opt).offCodeSumBasePrice) -
                                     ((uVar23 * 0x100 >> ((byte)uVar27 & 0x1f)) +
                                     (uVar32 * 0x100 >> ((byte)uVar33 & 0x1f)))) +
                                     ((ML_bits[uVar42] + uVar45) - (uVar27 + uVar33)) * 0x100 + 0x33
                            ;
                          }
                          iVar17 = iVar17 + UVar11 + (int)local_e0;
                          uVar23 = (int)local_100 + UVar13;
                          uVar34 = (ulong)uVar23;
                          if (((uint)uVar44 < uVar23) || (iVar17 < local_f8[uVar34].price)) {
                            if ((uint)uVar44 < uVar23) {
                              uVar44 = uVar44 & 0xffffffff;
                              pZVar24 = local_68 + uVar44;
                              do {
                                uVar44 = uVar44 + 1;
                                pZVar24->price = 0x40000000;
                                pZVar24 = pZVar24 + 1;
                              } while (uVar44 < uVar34);
                            }
                            local_f8[uVar34].mlen = UVar13;
                            local_f8[uVar34].off = UVar12;
                            local_f8[uVar34].litlen = (uint)local_188;
                            local_f8[uVar34].price = iVar17;
                          }
                          uVar39 = uVar39 - 1;
                        } while (uVar21 <= (uint)uVar39);
                      }
                      uVar36 = uVar36 + 1;
                    } while (uVar36 != (uint)local_1e8 + ((uint)local_1e8 == 0));
                    uVar21 = 0;
                  }
                }
              }
            }
            psVar35 = local_150;
            pZVar24 = local_f8;
            if (uVar21 < 0x11) {
              if (uVar21 != 0) {
                if (uVar21 != 7) goto LAB_00158fd9;
                goto LAB_00158c7c;
              }
            }
            else if (uVar21 != 0x13) {
              if (uVar21 != 0x11) goto LAB_00158fd9;
              break;
            }
            uVar21 = (int)local_100 + 1;
            pZVar22 = (ZSTD_optimal_t *)(ulong)uVar21;
          } while (uVar21 <= (uint)uVar44);
        }
        uVar36 = uVar44 & 0xffffffff;
        local_7c = pZVar24[uVar36].price;
        local_d4 = pZVar24[uVar36].off;
        local_88 = (ZSTD_optimal_t *)(ulong)pZVar24[uVar36].mlen;
        local_98 = (ZSTD_optimal_t *)(ulong)pZVar24[uVar36].litlen;
        local_58 = pZVar24[uVar36].rep[2];
        local_60 = *(undefined8 *)pZVar24[uVar36].rep;
        uVar45 = pZVar24[uVar36].litlen + pZVar24[uVar36].mlen;
        uVar21 = (uint)uVar44 - uVar45;
        if ((uint)uVar44 < uVar45) {
          uVar21 = 0;
        }
        local_100 = (ZSTD_optimal_t *)(ulong)uVar21;
        if (0xfff < uVar21) {
          __assert_fail("cur < ZSTD_OPT_NUM",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x4995,
                        "size_t ZSTD_compressBlock_opt_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const int, const ZSTD_dictMode_e)"
                       );
        }
        goto LAB_00158c7c;
      }
LAB_00158fd9:
    } while (puVar38 < local_70);
  }
  psVar35->lit = psVar35->litStart;
  psVar35->sequences = psVar35->sequencesStart;
  psVar35->longLengthID = 0;
  ppBVar1 = &(ms->window).base;
  *ppBVar1 = *ppBVar1 + -local_78;
  UVar12 = (int)local_78 + (ms->window).dictLimit;
  (ms->window).dictLimit = UVar12;
  (ms->window).lowLimit = UVar12;
  ms->nextToUpdate = UVar12;
  if ((ms->opt).literalCompressionMode != ZSTD_lcm_uncompressed) {
    puVar18 = local_b0->litFreq;
    lVar20 = 0;
    UVar12 = 0;
    do {
      iVar17 = puVar18[lVar20] * 0x10;
      puVar18[lVar20] = iVar17 - 1;
      UVar12 = (UVar12 + iVar17) - 1;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x100);
    (ms->opt).litSum = UVar12;
  }
  puVar18 = (ms->opt).litLengthFreq;
  lVar20 = 0;
  UVar12 = 0;
  do {
    iVar17 = puVar18[lVar20] * 0x10;
    puVar18[lVar20] = iVar17 - 1;
    UVar12 = (UVar12 + iVar17) - 1;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x24);
  (ms->opt).litLengthSum = UVar12;
  puVar18 = (ms->opt).matchLengthFreq;
  lVar20 = 0;
  UVar12 = 0;
  do {
    iVar17 = puVar18[lVar20] * 0x10;
    puVar18[lVar20] = iVar17 - 1;
    UVar12 = (UVar12 + iVar17) - 1;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x35);
  (ms->opt).matchLengthSum = UVar12;
  puVar18 = (ms->opt).offCodeFreq;
  lVar20 = 0;
  UVar12 = 0;
  do {
    iVar17 = puVar18[lVar20] * 0x10;
    puVar18[lVar20] = iVar17 - 1;
    UVar12 = (UVar12 + iVar17) - 1;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x20);
  (ms->opt).offCodeSum = UVar12;
  return;
}

Assistant:

static void
ZSTD_initStats_ultra(ZSTD_matchState_t* ms,
                     seqStore_t* seqStore,
                     U32 rep[ZSTD_REP_NUM],
               const void* src, size_t srcSize)
{
    U32 tmpRep[ZSTD_REP_NUM];  /* updated rep codes will sink here */
    memcpy(tmpRep, rep, sizeof(tmpRep));

    DEBUGLOG(4, "ZSTD_initStats_ultra (srcSize=%zu)", srcSize);
    assert(ms->opt.litLengthSum == 0);    /* first block */
    assert(seqStore->sequences == seqStore->sequencesStart);   /* no ldm */
    assert(ms->window.dictLimit == ms->window.lowLimit);   /* no dictionary */
    assert(ms->window.dictLimit - ms->nextToUpdate <= 1);  /* no prefix (note: intentional overflow, defined as 2-complement) */

    ZSTD_compressBlock_opt_generic(ms, seqStore, tmpRep, src, srcSize, 2 /*optLevel*/, ZSTD_noDict);   /* generate stats into ms->opt*/

    /* invalidate first scan from history */
    ZSTD_resetSeqStore(seqStore);
    ms->window.base -= srcSize;
    ms->window.dictLimit += (U32)srcSize;
    ms->window.lowLimit = ms->window.dictLimit;
    ms->nextToUpdate = ms->window.dictLimit;

    /* re-inforce weight of collected statistics */
    ZSTD_upscaleStats(&ms->opt);
}